

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  Geometry *pGVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined8 uVar21;
  int iVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  bool bVar69;
  byte bVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  Geometry *geometry;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  long lVar75;
  long lVar76;
  byte bVar77;
  float fVar78;
  float fVar126;
  float fVar128;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar83 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar84 [16];
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar132;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar133;
  undefined4 uVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar139 [32];
  float fVar142;
  undefined8 uVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  float fVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_650;
  undefined1 local_620 [32];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  long local_530;
  ulong local_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_450 [8];
  float fStack_448;
  float fStack_444;
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined4 local_380;
  int local_37c;
  undefined1 local_370 [16];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar71 = (ulong)(byte)prim[1];
  fVar142 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar20 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar83 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar147 = vsubps_avx(auVar20,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  fVar149 = fVar142 * auVar147._0_4_;
  fVar133 = fVar142 * auVar83._0_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar20);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar81);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar82);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar91 = vpmovsxbd_avx2(auVar80);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar71 * 0xc + 6);
  auVar92 = vpmovsxbd_avx2(auVar79);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar71 * 0xd + 6);
  auVar94 = vpmovsxbd_avx2(auVar7);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar71 * 0x12 + 6);
  auVar102 = vpmovsxbd_avx2(auVar8);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar71 * 0x13 + 6);
  auVar101 = vpmovsxbd_avx2(auVar9);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar71 * 0x14 + 6);
  auVar96 = vpmovsxbd_avx2(auVar10);
  auVar95 = vcvtdq2ps_avx(auVar96);
  auVar177._4_4_ = fVar133;
  auVar177._0_4_ = fVar133;
  auVar177._8_4_ = fVar133;
  auVar177._12_4_ = fVar133;
  auVar177._16_4_ = fVar133;
  auVar177._20_4_ = fVar133;
  auVar177._24_4_ = fVar133;
  auVar177._28_4_ = fVar133;
  auVar179._8_4_ = 1;
  auVar179._0_8_ = 0x100000001;
  auVar179._12_4_ = 1;
  auVar179._16_4_ = 1;
  auVar179._20_4_ = 1;
  auVar179._24_4_ = 1;
  auVar179._28_4_ = 1;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar88 = ZEXT1632(CONCAT412(fVar142 * auVar83._12_4_,
                               CONCAT48(fVar142 * auVar83._8_4_,
                                        CONCAT44(fVar142 * auVar83._4_4_,fVar133))));
  auVar87 = vpermps_avx2(auVar179,auVar88);
  auVar86 = vpermps_avx512vl(auVar85,auVar88);
  fVar133 = auVar86._0_4_;
  auVar189._0_4_ = fVar133 * auVar90._0_4_;
  fVar140 = auVar86._4_4_;
  auVar189._4_4_ = fVar140 * auVar90._4_4_;
  fVar141 = auVar86._8_4_;
  auVar189._8_4_ = fVar141 * auVar90._8_4_;
  fVar167 = auVar86._12_4_;
  auVar189._12_4_ = fVar167 * auVar90._12_4_;
  fVar169 = auVar86._16_4_;
  auVar189._16_4_ = fVar169 * auVar90._16_4_;
  fVar166 = auVar86._20_4_;
  auVar189._20_4_ = fVar166 * auVar90._20_4_;
  fVar168 = auVar86._24_4_;
  auVar189._28_36_ = in_ZMM4._28_36_;
  auVar189._24_4_ = fVar168 * auVar90._24_4_;
  auVar88._4_4_ = auVar94._4_4_ * fVar140;
  auVar88._0_4_ = auVar94._0_4_ * fVar133;
  auVar88._8_4_ = auVar94._8_4_ * fVar141;
  auVar88._12_4_ = auVar94._12_4_ * fVar167;
  auVar88._16_4_ = auVar94._16_4_ * fVar169;
  auVar88._20_4_ = auVar94._20_4_ * fVar166;
  auVar88._24_4_ = auVar94._24_4_ * fVar168;
  auVar88._28_4_ = auVar96._28_4_;
  auVar96._4_4_ = auVar95._4_4_ * fVar140;
  auVar96._0_4_ = auVar95._0_4_ * fVar133;
  auVar96._8_4_ = auVar95._8_4_ * fVar141;
  auVar96._12_4_ = auVar95._12_4_ * fVar167;
  auVar96._16_4_ = auVar95._16_4_ * fVar169;
  auVar96._20_4_ = auVar95._20_4_ * fVar166;
  auVar96._24_4_ = auVar95._24_4_ * fVar168;
  auVar96._28_4_ = auVar86._28_4_;
  auVar20 = vfmadd231ps_fma(auVar189._0_32_,auVar87,auVar89);
  auVar81 = vfmadd231ps_fma(auVar88,auVar87,auVar92);
  auVar82 = vfmadd231ps_fma(auVar96,auVar101,auVar87);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar177,auVar93);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar177,auVar91);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,auVar177);
  auVar178._4_4_ = fVar149;
  auVar178._0_4_ = fVar149;
  auVar178._8_4_ = fVar149;
  auVar178._12_4_ = fVar149;
  auVar178._16_4_ = fVar149;
  auVar178._20_4_ = fVar149;
  auVar178._24_4_ = fVar149;
  auVar178._28_4_ = fVar149;
  auVar87 = ZEXT1632(CONCAT412(fVar142 * auVar147._12_4_,
                               CONCAT48(fVar142 * auVar147._8_4_,
                                        CONCAT44(fVar142 * auVar147._4_4_,fVar149))));
  auVar96 = vpermps_avx2(auVar179,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  auVar88 = vmulps_avx512vl(auVar87,auVar90);
  auVar98._0_4_ = auVar87._0_4_ * auVar94._0_4_;
  auVar98._4_4_ = auVar87._4_4_ * auVar94._4_4_;
  auVar98._8_4_ = auVar87._8_4_ * auVar94._8_4_;
  auVar98._12_4_ = auVar87._12_4_ * auVar94._12_4_;
  auVar98._16_4_ = auVar87._16_4_ * auVar94._16_4_;
  auVar98._20_4_ = auVar87._20_4_ * auVar94._20_4_;
  auVar98._24_4_ = auVar87._24_4_ * auVar94._24_4_;
  auVar98._28_4_ = 0;
  auVar94._4_4_ = auVar87._4_4_ * auVar95._4_4_;
  auVar94._0_4_ = auVar87._0_4_ * auVar95._0_4_;
  auVar94._8_4_ = auVar87._8_4_ * auVar95._8_4_;
  auVar94._12_4_ = auVar87._12_4_ * auVar95._12_4_;
  auVar94._16_4_ = auVar87._16_4_ * auVar95._16_4_;
  auVar94._20_4_ = auVar87._20_4_ * auVar95._20_4_;
  auVar94._24_4_ = auVar87._24_4_ * auVar95._24_4_;
  auVar94._28_4_ = auVar90._28_4_;
  auVar89 = vfmadd231ps_avx512vl(auVar88,auVar96,auVar89);
  auVar80 = vfmadd231ps_fma(auVar98,auVar96,auVar92);
  auVar79 = vfmadd231ps_fma(auVar94,auVar96,auVar101);
  auVar89 = vfmadd231ps_avx512vl(auVar89,auVar178,auVar93);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar178,auVar91);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar170._16_4_ = 0x7fffffff;
  auVar170._20_4_ = 0x7fffffff;
  auVar170._24_4_ = 0x7fffffff;
  auVar170._28_4_ = 0x7fffffff;
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar178,auVar102);
  auVar93 = vandps_avx(ZEXT1632(auVar20),auVar170);
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar93,auVar100,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar87._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar20._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar81),auVar170);
  uVar72 = vcmpps_avx512vl(auVar93,auVar100,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar85._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar81._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar82),auVar170);
  uVar72 = vcmpps_avx512vl(auVar93,auVar100,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar93._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar82._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar82._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar82._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar82._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar72 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar87);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = vfnmadd213ps_avx512vl(auVar87,auVar90,auVar91);
  auVar20 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar85);
  auVar92 = vfnmadd213ps_avx512vl(auVar85,auVar90,auVar91);
  auVar81 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar93);
  auVar93 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
  auVar82 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar89);
  auVar102._4_4_ = auVar20._4_4_ * auVar93._4_4_;
  auVar102._0_4_ = auVar20._0_4_ * auVar93._0_4_;
  auVar102._8_4_ = auVar20._8_4_ * auVar93._8_4_;
  auVar102._12_4_ = auVar20._12_4_ * auVar93._12_4_;
  auVar102._16_4_ = auVar93._16_4_ * 0.0;
  auVar102._20_4_ = auVar93._20_4_ * 0.0;
  auVar102._24_4_ = auVar93._24_4_ * 0.0;
  auVar102._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx512vl(auVar93,auVar89);
  auVar99._0_4_ = auVar20._0_4_ * auVar93._0_4_;
  auVar99._4_4_ = auVar20._4_4_ * auVar93._4_4_;
  auVar99._8_4_ = auVar20._8_4_ * auVar93._8_4_;
  auVar99._12_4_ = auVar20._12_4_ * auVar93._12_4_;
  auVar99._16_4_ = auVar93._16_4_ * 0.0;
  auVar99._20_4_ = auVar93._20_4_ * 0.0;
  auVar99._24_4_ = auVar93._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0xe + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar80));
  auVar101._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar101._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar101._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = auVar93._28_4_;
  auVar94 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar80));
  auVar97._0_4_ = auVar81._0_4_ * auVar93._0_4_;
  auVar97._4_4_ = auVar81._4_4_ * auVar93._4_4_;
  auVar97._8_4_ = auVar81._8_4_ * auVar93._8_4_;
  auVar97._12_4_ = auVar81._12_4_ * auVar93._12_4_;
  auVar97._16_4_ = auVar93._16_4_ * 0.0;
  auVar97._20_4_ = auVar93._20_4_ * 0.0;
  auVar97._24_4_ = auVar93._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x15 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar79));
  auVar95._4_4_ = auVar93._4_4_ * auVar82._4_4_;
  auVar95._0_4_ = auVar93._0_4_ * auVar82._0_4_;
  auVar95._8_4_ = auVar93._8_4_ * auVar82._8_4_;
  auVar95._12_4_ = auVar93._12_4_ * auVar82._12_4_;
  auVar95._16_4_ = auVar93._16_4_ * 0.0;
  auVar95._20_4_ = auVar93._20_4_ * 0.0;
  auVar95._24_4_ = auVar93._24_4_ * 0.0;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar79));
  auVar86._0_4_ = auVar82._0_4_ * auVar93._0_4_;
  auVar86._4_4_ = auVar82._4_4_ * auVar93._4_4_;
  auVar86._8_4_ = auVar82._8_4_ * auVar93._8_4_;
  auVar86._12_4_ = auVar82._12_4_ * auVar93._12_4_;
  auVar86._16_4_ = auVar93._16_4_ * 0.0;
  auVar86._20_4_ = auVar93._20_4_ * 0.0;
  auVar86._24_4_ = auVar93._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar102,auVar99);
  auVar89 = vpminsd_avx2(auVar101,auVar97);
  auVar93 = vmaxps_avx(auVar93,auVar89);
  auVar89 = vpminsd_avx2(auVar95,auVar86);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar90._4_4_ = uVar134;
  auVar90._0_4_ = uVar134;
  auVar90._8_4_ = uVar134;
  auVar90._12_4_ = uVar134;
  auVar90._16_4_ = uVar134;
  auVar90._20_4_ = uVar134;
  auVar90._24_4_ = uVar134;
  auVar90._28_4_ = uVar134;
  auVar89 = vmaxps_avx512vl(auVar89,auVar90);
  auVar93 = vmaxps_avx(auVar93,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar89);
  auVar93 = vpmaxsd_avx2(auVar102,auVar99);
  auVar89 = vpmaxsd_avx2(auVar101,auVar97);
  auVar93 = vminps_avx(auVar93,auVar89);
  auVar89 = vpmaxsd_avx2(auVar95,auVar86);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar91._4_4_ = uVar134;
  auVar91._0_4_ = uVar134;
  auVar91._8_4_ = uVar134;
  auVar91._12_4_ = uVar134;
  auVar91._16_4_ = uVar134;
  auVar91._20_4_ = uVar134;
  auVar91._24_4_ = uVar134;
  auVar91._28_4_ = uVar134;
  auVar89 = vminps_avx512vl(auVar89,auVar91);
  auVar93 = vminps_avx(auVar93,auVar89);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar92);
  uVar143 = vcmpps_avx512vl(local_80,auVar93,2);
  uVar21 = vpcmpgtd_avx512vl(auVar94,_DAT_01fb4ba0);
  local_528 = (ulong)(byte)((byte)uVar143 & (byte)uVar21);
  local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  while (local_528 != 0) {
    iVar22 = 0;
    for (uVar72 = local_528; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      iVar22 = iVar22 + 1;
    }
    uVar74 = local_528 - 1 & local_528;
    uVar72 = (ulong)(uint)(iVar22 << 6);
    uVar11 = *(uint *)(prim + 2);
    pGVar12 = (context->scene->geometries).items[uVar11].ptr;
    auVar20 = *(undefined1 (*) [16])(prim + uVar72 + uVar71 * 0x19 + 0x16);
    if (uVar74 != 0) {
      uVar73 = uVar74 - 1 & uVar74;
      for (uVar23 = uVar74; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
      }
      if (uVar73 != 0) {
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_5f0 = *(undefined1 (*) [16])(prim + uVar72 + uVar71 * 0x19 + 0x26);
    local_600 = *(undefined1 (*) [16])(prim + uVar72 + uVar71 * 0x19 + 0x36);
    _local_450 = *(undefined1 (*) [16])(prim + uVar72 + uVar71 * 0x19 + 0x46);
    iVar22 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                            0x1c);
    auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar80 = vsubps_avx(auVar20,auVar81);
    uVar134 = auVar80._0_4_;
    auVar83._4_4_ = uVar134;
    auVar83._0_4_ = uVar134;
    auVar83._8_4_ = uVar134;
    auVar83._12_4_ = uVar134;
    auVar82 = vshufps_avx(auVar80,auVar80,0x55);
    auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
    aVar5 = pre->ray_space[k].vx.field_0;
    aVar6 = pre->ray_space[k].vy.field_0;
    fVar142 = pre->ray_space[k].vz.field_0.m128[0];
    fVar133 = pre->ray_space[k].vz.field_0.m128[1];
    fVar140 = pre->ray_space[k].vz.field_0.m128[2];
    fVar141 = pre->ray_space[k].vz.field_0.m128[3];
    auVar84._0_4_ = fVar142 * auVar80._0_4_;
    auVar84._4_4_ = fVar133 * auVar80._4_4_;
    auVar84._8_4_ = fVar140 * auVar80._8_4_;
    auVar84._12_4_ = fVar141 * auVar80._12_4_;
    auVar82 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar82);
    auVar7 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar5,auVar83);
    auVar82 = vshufps_avx(auVar20,auVar20,0xff);
    auVar79 = vsubps_avx(local_5f0,auVar81);
    uVar134 = auVar79._0_4_;
    auVar150._4_4_ = uVar134;
    auVar150._0_4_ = uVar134;
    auVar150._8_4_ = uVar134;
    auVar150._12_4_ = uVar134;
    auVar80 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar172._0_4_ = fVar142 * auVar79._0_4_;
    auVar172._4_4_ = fVar133 * auVar79._4_4_;
    auVar172._8_4_ = fVar140 * auVar79._8_4_;
    auVar172._12_4_ = fVar141 * auVar79._12_4_;
    auVar80 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar6,auVar80);
    auVar8 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar150);
    auVar79 = vsubps_avx512vl(local_600,auVar81);
    uVar134 = auVar79._0_4_;
    auVar151._4_4_ = uVar134;
    auVar151._0_4_ = uVar134;
    auVar151._8_4_ = uVar134;
    auVar151._12_4_ = uVar134;
    auVar80 = vshufps_avx(auVar79,auVar79,0x55);
    auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
    auVar174._0_4_ = fVar142 * auVar79._0_4_;
    auVar174._4_4_ = fVar133 * auVar79._4_4_;
    auVar174._8_4_ = fVar140 * auVar79._8_4_;
    auVar174._12_4_ = fVar141 * auVar79._12_4_;
    auVar80 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar6,auVar80);
    auVar79 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar5,auVar151);
    auVar80 = vsubps_avx512vl(_local_450,auVar81);
    uVar134 = auVar80._0_4_;
    auVar147._4_4_ = uVar134;
    auVar147._0_4_ = uVar134;
    auVar147._8_4_ = uVar134;
    auVar147._12_4_ = uVar134;
    auVar81 = vshufps_avx(auVar80,auVar80,0x55);
    auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
    auVar175._0_4_ = fVar142 * auVar80._0_4_;
    auVar175._4_4_ = fVar133 * auVar80._4_4_;
    auVar175._8_4_ = fVar140 * auVar80._8_4_;
    auVar175._12_4_ = fVar141 * auVar80._12_4_;
    auVar81 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar6,auVar81);
    auVar9 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar5,auVar147);
    local_530 = (long)iVar22;
    lVar76 = local_530 * 0x44;
    auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar76);
    local_4a0 = vbroadcastss_avx512vl(auVar7);
    auVar89 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 + 0x484);
    auVar139._8_4_ = 1;
    auVar139._0_8_ = 0x100000001;
    auVar139._12_4_ = 1;
    auVar139._16_4_ = 1;
    auVar139._20_4_ = 1;
    auVar139._24_4_ = 1;
    auVar139._28_4_ = 1;
    local_4c0 = vpermps_avx512vl(auVar139,ZEXT1632(auVar7));
    uVar134 = auVar8._0_4_;
    local_4e0._4_4_ = uVar134;
    local_4e0._0_4_ = uVar134;
    local_4e0._8_4_ = uVar134;
    local_4e0._12_4_ = uVar134;
    local_4e0._16_4_ = uVar134;
    local_4e0._20_4_ = uVar134;
    local_4e0._24_4_ = uVar134;
    local_4e0._28_4_ = uVar134;
    local_500 = vpermps_avx2(auVar139,ZEXT1632(auVar8));
    auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 + 0x908);
    local_620 = vbroadcastss_avx512vl(auVar79);
    local_5a0 = vpermps_avx512vl(auVar139,ZEXT1632(auVar79));
    auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 + 0xd8c);
    local_5c0 = vbroadcastss_avx512vl(auVar9);
    auVar189 = ZEXT3264(local_5c0);
    local_5e0 = vpermps_avx512vl(auVar139,ZEXT1632(auVar9));
    auVar190 = ZEXT3264(local_5e0);
    auVar92 = vmulps_avx512vl(local_5c0,auVar91);
    auVar94 = vmulps_avx512vl(local_5e0,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar90,local_620);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_5a0);
    auVar81 = vfmadd231ps_fma(auVar92,auVar89,local_4e0);
    auVar80 = vfmadd231ps_fma(auVar94,auVar89,local_500);
    auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar93,local_4a0);
    auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar76);
    auVar94 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 + 0x484);
    auVar102 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 + 0x908);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar93,local_4c0);
    auVar101 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 + 0xd8c);
    auVar87 = vmulps_avx512vl(local_5c0,auVar101);
    auVar88 = vmulps_avx512vl(local_5e0,auVar101);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_620);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_5a0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar94,local_4e0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_500);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,local_4a0);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar92,local_4c0);
    auVar85 = vsubps_avx512vl(auVar87,auVar95);
    auVar86 = vsubps_avx512vl(auVar88,auVar96);
    auVar97 = vmulps_avx512vl(auVar96,auVar85);
    auVar98 = vmulps_avx512vl(auVar95,auVar86);
    auVar97 = vsubps_avx512vl(auVar97,auVar98);
    auVar81 = vshufps_avx(local_5f0,local_5f0,0xff);
    uVar143 = auVar82._0_8_;
    local_a0._8_8_ = uVar143;
    local_a0._0_8_ = uVar143;
    local_a0._16_8_ = uVar143;
    local_a0._24_8_ = uVar143;
    local_c0 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx512vl(local_600,local_600,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar81);
    auVar81 = vshufps_avx512vl(_local_450,_local_450,0xff);
    uVar143 = auVar81._0_8_;
    register0x000012c8 = uVar143;
    local_100 = uVar143;
    register0x000012d0 = uVar143;
    register0x000012d8 = uVar143;
    auVar98 = vmulps_avx512vl(_local_100,auVar91);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar90,local_e0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,local_c0);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,local_a0);
    auVar99 = vmulps_avx512vl(_local_100,auVar101);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar102,local_e0);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,local_c0);
    auVar10 = vfmadd231ps_fma(auVar99,auVar92,local_a0);
    auVar99 = vmulps_avx512vl(auVar86,auVar86);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar85);
    auVar100 = vmaxps_avx512vl(auVar98,ZEXT1632(auVar10));
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vmulps_avx512vl(auVar100,auVar99);
    auVar97 = vmulps_avx512vl(auVar97,auVar97);
    uVar143 = vcmpps_avx512vl(auVar97,auVar99,2);
    auVar81 = vblendps_avx(auVar7,auVar20,8);
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar82 = vandps_avx512vl(auVar81,auVar80);
    auVar81 = vblendps_avx(auVar8,local_5f0,8);
    auVar81 = vandps_avx512vl(auVar81,auVar80);
    auVar82 = vmaxps_avx(auVar82,auVar81);
    auVar81 = vblendps_avx(auVar79,local_600,8);
    auVar83 = vandps_avx512vl(auVar81,auVar80);
    auVar81 = vblendps_avx(auVar9,_local_450,8);
    auVar81 = vandps_avx512vl(auVar81,auVar80);
    auVar81 = vmaxps_avx(auVar83,auVar81);
    auVar81 = vmaxps_avx(auVar82,auVar81);
    auVar82 = vmovshdup_avx(auVar81);
    auVar82 = vmaxss_avx(auVar82,auVar81);
    auVar81 = vshufpd_avx(auVar81,auVar81,1);
    auVar80 = vcvtsi2ss_avx512f(local_600,iVar22);
    auVar81 = vmaxss_avx(auVar81,auVar82);
    local_420._0_16_ = auVar80;
    fVar133 = auVar80._0_4_;
    auVar176._4_4_ = fVar133;
    auVar176._0_4_ = fVar133;
    auVar176._8_4_ = fVar133;
    auVar176._12_4_ = fVar133;
    auVar176._16_4_ = fVar133;
    auVar176._20_4_ = fVar133;
    auVar176._24_4_ = fVar133;
    auVar176._28_4_ = fVar133;
    uVar21 = vcmpps_avx512vl(auVar176,_DAT_01f7b060,0xe);
    bVar77 = (byte)uVar143 & (byte)uVar21;
    fVar142 = auVar81._0_4_ * 4.7683716e-07;
    auVar148._8_4_ = 2;
    auVar148._0_8_ = 0x200000002;
    auVar148._12_4_ = 2;
    auVar148._16_4_ = 2;
    auVar148._20_4_ = 2;
    auVar148._24_4_ = 2;
    auVar148._28_4_ = 2;
    local_120 = vpermps_avx512vl(auVar148,ZEXT1632(auVar7));
    local_140 = vpermps_avx512vl(auVar148,ZEXT1632(auVar8));
    local_160 = vpermps_avx512vl(auVar148,ZEXT1632(auVar79));
    local_580 = vpermps_avx2(auVar148,ZEXT1632(auVar9));
    uVar134 = *(undefined4 *)(ray + k * 4 + 0x60);
    local_2a0 = vpbroadcastd_avx512vl();
    if (bVar77 == 0) {
      bVar69 = false;
      auVar81 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
      auVar184 = ZEXT1664(auVar81);
      auVar185 = ZEXT3264(local_4a0);
      auVar186 = ZEXT3264(local_4c0);
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar191 = ZEXT3264(auVar93);
      auVar187 = ZEXT3264(local_4e0);
      auVar183 = ZEXT3264(local_500);
      auVar182 = ZEXT3264(local_620);
      auVar188 = ZEXT3264(local_5a0);
    }
    else {
      auVar101 = vmulps_avx512vl(local_580,auVar101);
      auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar101);
      auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar102);
      auVar94 = vfmadd213ps_avx512vl(auVar92,local_120,auVar94);
      auVar91 = vmulps_avx512vl(local_580,auVar91);
      auVar90 = vfmadd213ps_avx512vl(auVar90,local_160,auVar91);
      auVar102 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
      auVar89 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 + 0x1210);
      auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 + 0x1694);
      auVar91 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 + 0x1b18);
      auVar92 = *(undefined1 (*) [32])(bspline_basis0 + lVar76 + 0x1f9c);
      auVar102 = vfmadd213ps_avx512vl(auVar93,local_120,auVar102);
      auVar93 = vmulps_avx512vl(local_5c0,auVar92);
      auVar101 = vmulps_avx512vl(local_5e0,auVar92);
      auVar92 = vmulps_avx512vl(local_580,auVar92);
      auVar81 = vfmadd231ps_fma(auVar93,auVar91,local_620);
      auVar93 = vfmadd231ps_avx512vl(auVar101,auVar91,local_5a0);
      auVar91 = vfmadd231ps_avx512vl(auVar92,local_160,auVar91);
      auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar90,local_4e0);
      auVar183 = ZEXT3264(local_500);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_500);
      auVar101 = vfmadd231ps_avx512vl(auVar91,local_140,auVar90);
      auVar81 = vfmadd231ps_fma(auVar92,auVar89,local_4a0);
      auVar92 = vfmadd231ps_avx512vl(auVar93,auVar89,local_4c0);
      auVar93 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 + 0x1210);
      auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 + 0x1b18);
      auVar91 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 + 0x1f9c);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_120,auVar89);
      auVar89 = vmulps_avx512vl(local_5c0,auVar91);
      auVar97 = vmulps_avx512vl(local_5e0,auVar91);
      auVar91 = vmulps_avx512vl(local_580,auVar91);
      auVar99 = vfmadd231ps_avx512vl(auVar89,auVar90,local_620);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,local_5a0);
      auVar90 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
      auVar89 = *(undefined1 (*) [32])(bspline_basis1 + lVar76 + 0x1694);
      auVar91 = vfmadd231ps_avx512vl(auVar99,auVar89,local_4e0);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar89,local_500);
      auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
      auVar82 = vfmadd231ps_fma(auVar91,auVar93,local_4a0);
      auVar90 = vfmadd231ps_avx512vl(auVar97,auVar93,local_4c0);
      auVar91 = vfmadd231ps_avx512vl(auVar89,local_120,auVar93);
      auVar180._8_4_ = 0x7fffffff;
      auVar180._0_8_ = 0x7fffffff7fffffff;
      auVar180._12_4_ = 0x7fffffff;
      auVar180._16_4_ = 0x7fffffff;
      auVar180._20_4_ = 0x7fffffff;
      auVar180._24_4_ = 0x7fffffff;
      auVar180._28_4_ = 0x7fffffff;
      auVar93 = vandps_avx(ZEXT1632(auVar81),auVar180);
      auVar89 = vandps_avx(auVar92,auVar180);
      auVar89 = vmaxps_avx(auVar93,auVar89);
      auVar93 = vandps_avx(auVar101,auVar180);
      auVar93 = vmaxps_avx(auVar89,auVar93);
      auVar101 = vbroadcastss_avx512vl(ZEXT416((uint)fVar142));
      uVar72 = vcmpps_avx512vl(auVar93,auVar101,1);
      bVar69 = (bool)((byte)uVar72 & 1);
      auVar103._0_4_ = (float)((uint)bVar69 * auVar85._0_4_ | (uint)!bVar69 * auVar81._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * auVar81._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * auVar81._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * auVar81._12_4_);
      fVar140 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar85._16_4_);
      auVar103._16_4_ = fVar140;
      fVar141 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar85._20_4_);
      auVar103._20_4_ = fVar141;
      fVar167 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar85._24_4_);
      auVar103._24_4_ = fVar167;
      uVar1 = (uint)(byte)(uVar72 >> 7) * auVar85._28_4_;
      auVar103._28_4_ = uVar1;
      bVar69 = (bool)((byte)uVar72 & 1);
      auVar104._0_4_ = (float)((uint)bVar69 * auVar86._0_4_ | (uint)!bVar69 * auVar92._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar69 * auVar86._4_4_ | (uint)!bVar69 * auVar92._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar69 * auVar86._8_4_ | (uint)!bVar69 * auVar92._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar69 * auVar86._12_4_ | (uint)!bVar69 * auVar92._12_4_);
      bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar69 * auVar86._16_4_ | (uint)!bVar69 * auVar92._16_4_);
      bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar69 * auVar86._20_4_ | (uint)!bVar69 * auVar92._20_4_);
      bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar69 * auVar86._24_4_ | (uint)!bVar69 * auVar92._24_4_);
      bVar69 = SUB81(uVar72 >> 7,0);
      auVar104._28_4_ = (uint)bVar69 * auVar86._28_4_ | (uint)!bVar69 * auVar92._28_4_;
      auVar93 = vandps_avx(auVar180,ZEXT1632(auVar82));
      auVar89 = vandps_avx(auVar90,auVar180);
      auVar89 = vmaxps_avx(auVar93,auVar89);
      auVar93 = vandps_avx(auVar91,auVar180);
      auVar93 = vmaxps_avx(auVar89,auVar93);
      uVar72 = vcmpps_avx512vl(auVar93,auVar101,1);
      bVar69 = (bool)((byte)uVar72 & 1);
      auVar105._0_4_ = (float)((uint)bVar69 * auVar85._0_4_ | (uint)!bVar69 * auVar82._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar69 * auVar85._4_4_ | (uint)!bVar69 * auVar82._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar69 * auVar85._8_4_ | (uint)!bVar69 * auVar82._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar69 * auVar85._12_4_ | (uint)!bVar69 * auVar82._12_4_);
      fVar169 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar85._16_4_);
      auVar105._16_4_ = fVar169;
      fVar166 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar85._20_4_);
      auVar105._20_4_ = fVar166;
      fVar168 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar85._24_4_);
      auVar105._24_4_ = fVar168;
      auVar105._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar85._28_4_;
      bVar69 = (bool)((byte)uVar72 & 1);
      auVar106._0_4_ = (float)((uint)bVar69 * auVar86._0_4_ | (uint)!bVar69 * auVar90._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar69 * auVar86._4_4_ | (uint)!bVar69 * auVar90._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar69 * auVar86._8_4_ | (uint)!bVar69 * auVar90._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar69 * auVar86._12_4_ | (uint)!bVar69 * auVar90._12_4_);
      bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar69 * auVar86._16_4_ | (uint)!bVar69 * auVar90._16_4_);
      bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar69 * auVar86._20_4_ | (uint)!bVar69 * auVar90._20_4_);
      bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar69 * auVar86._24_4_ | (uint)!bVar69 * auVar90._24_4_);
      bVar69 = SUB81(uVar72 >> 7,0);
      auVar106._28_4_ = (uint)bVar69 * auVar86._28_4_ | (uint)!bVar69 * auVar90._28_4_;
      auVar84 = vxorps_avx512vl(local_620._0_16_,local_620._0_16_);
      auVar184 = ZEXT1664(auVar84);
      auVar93 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar84));
      auVar81 = vfmadd231ps_fma(auVar93,auVar104,auVar104);
      auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      fVar149 = auVar93._0_4_;
      fVar78 = auVar93._4_4_;
      fVar126 = auVar93._8_4_;
      fVar127 = auVar93._12_4_;
      fVar128 = auVar93._16_4_;
      fVar129 = auVar93._20_4_;
      fVar130 = auVar93._24_4_;
      auVar33._4_4_ = fVar78 * fVar78 * fVar78 * auVar81._4_4_ * -0.5;
      auVar33._0_4_ = fVar149 * fVar149 * fVar149 * auVar81._0_4_ * -0.5;
      auVar33._8_4_ = fVar126 * fVar126 * fVar126 * auVar81._8_4_ * -0.5;
      auVar33._12_4_ = fVar127 * fVar127 * fVar127 * auVar81._12_4_ * -0.5;
      auVar33._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
      auVar33._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar33._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar33._28_4_ = 0;
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar90 = vfmadd231ps_avx512vl(auVar33,auVar89,auVar93);
      auVar34._4_4_ = auVar104._4_4_ * auVar90._4_4_;
      auVar34._0_4_ = auVar104._0_4_ * auVar90._0_4_;
      auVar34._8_4_ = auVar104._8_4_ * auVar90._8_4_;
      auVar34._12_4_ = auVar104._12_4_ * auVar90._12_4_;
      auVar34._16_4_ = auVar104._16_4_ * auVar90._16_4_;
      auVar34._20_4_ = auVar104._20_4_ * auVar90._20_4_;
      auVar34._24_4_ = auVar104._24_4_ * auVar90._24_4_;
      auVar34._28_4_ = auVar93._28_4_;
      auVar35._4_4_ = auVar90._4_4_ * -auVar103._4_4_;
      auVar35._0_4_ = auVar90._0_4_ * -auVar103._0_4_;
      auVar35._8_4_ = auVar90._8_4_ * -auVar103._8_4_;
      auVar35._12_4_ = auVar90._12_4_ * -auVar103._12_4_;
      auVar35._16_4_ = auVar90._16_4_ * -fVar140;
      auVar35._20_4_ = auVar90._20_4_ * -fVar141;
      auVar35._24_4_ = auVar90._24_4_ * -fVar167;
      auVar35._28_4_ = uVar1 ^ 0x80000000;
      auVar93 = vmulps_avx512vl(auVar90,ZEXT1632(auVar84));
      auVar85 = ZEXT1632(auVar84);
      auVar91 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar85);
      auVar81 = vfmadd231ps_fma(auVar91,auVar106,auVar106);
      auVar91 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
      fVar140 = auVar91._0_4_;
      fVar141 = auVar91._4_4_;
      fVar167 = auVar91._8_4_;
      fVar149 = auVar91._12_4_;
      fVar78 = auVar91._16_4_;
      fVar126 = auVar91._20_4_;
      fVar127 = auVar91._24_4_;
      auVar36._4_4_ = fVar141 * fVar141 * fVar141 * auVar81._4_4_ * -0.5;
      auVar36._0_4_ = fVar140 * fVar140 * fVar140 * auVar81._0_4_ * -0.5;
      auVar36._8_4_ = fVar167 * fVar167 * fVar167 * auVar81._8_4_ * -0.5;
      auVar36._12_4_ = fVar149 * fVar149 * fVar149 * auVar81._12_4_ * -0.5;
      auVar36._16_4_ = fVar78 * fVar78 * fVar78 * -0.0;
      auVar36._20_4_ = fVar126 * fVar126 * fVar126 * -0.0;
      auVar36._24_4_ = fVar127 * fVar127 * fVar127 * -0.0;
      auVar36._28_4_ = 0;
      auVar89 = vfmadd231ps_avx512vl(auVar36,auVar89,auVar91);
      auVar37._4_4_ = auVar106._4_4_ * auVar89._4_4_;
      auVar37._0_4_ = auVar106._0_4_ * auVar89._0_4_;
      auVar37._8_4_ = auVar106._8_4_ * auVar89._8_4_;
      auVar37._12_4_ = auVar106._12_4_ * auVar89._12_4_;
      auVar37._16_4_ = auVar106._16_4_ * auVar89._16_4_;
      auVar37._20_4_ = auVar106._20_4_ * auVar89._20_4_;
      auVar37._24_4_ = auVar106._24_4_ * auVar89._24_4_;
      auVar37._28_4_ = auVar91._28_4_;
      auVar38._4_4_ = -auVar105._4_4_ * auVar89._4_4_;
      auVar38._0_4_ = -auVar105._0_4_ * auVar89._0_4_;
      auVar38._8_4_ = -auVar105._8_4_ * auVar89._8_4_;
      auVar38._12_4_ = -auVar105._12_4_ * auVar89._12_4_;
      auVar38._16_4_ = -fVar169 * auVar89._16_4_;
      auVar38._20_4_ = -fVar166 * auVar89._20_4_;
      auVar38._24_4_ = -fVar168 * auVar89._24_4_;
      auVar38._28_4_ = auVar90._28_4_;
      auVar89 = vmulps_avx512vl(auVar89,auVar85);
      auVar81 = vfmadd213ps_fma(auVar34,auVar98,auVar95);
      auVar82 = vfmadd213ps_fma(auVar35,auVar98,auVar96);
      auVar90 = vfmadd213ps_avx512vl(auVar93,auVar98,auVar102);
      auVar91 = vfmadd213ps_avx512vl(auVar37,ZEXT1632(auVar10),auVar87);
      auVar9 = vfnmadd213ps_fma(auVar34,auVar98,auVar95);
      auVar101 = ZEXT1632(auVar10);
      auVar80 = vfmadd213ps_fma(auVar38,auVar101,auVar88);
      auVar83 = vfnmadd213ps_fma(auVar35,auVar98,auVar96);
      auVar79 = vfmadd213ps_fma(auVar89,auVar101,auVar94);
      auVar92 = vfnmadd231ps_avx512vl(auVar102,auVar98,auVar93);
      auVar147 = vfnmadd213ps_fma(auVar37,auVar101,auVar87);
      auVar150 = vfnmadd213ps_fma(auVar38,auVar101,auVar88);
      auVar151 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar10),auVar89);
      auVar89 = vsubps_avx512vl(auVar91,ZEXT1632(auVar9));
      auVar93 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar83));
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar79),auVar92);
      auVar102 = vmulps_avx512vl(auVar93,auVar92);
      auVar7 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar83),auVar94);
      auVar39._4_4_ = auVar9._4_4_ * auVar94._4_4_;
      auVar39._0_4_ = auVar9._0_4_ * auVar94._0_4_;
      auVar39._8_4_ = auVar9._8_4_ * auVar94._8_4_;
      auVar39._12_4_ = auVar9._12_4_ * auVar94._12_4_;
      auVar39._16_4_ = auVar94._16_4_ * 0.0;
      auVar39._20_4_ = auVar94._20_4_ * 0.0;
      auVar39._24_4_ = auVar94._24_4_ * 0.0;
      auVar39._28_4_ = auVar94._28_4_;
      auVar94 = vfmsub231ps_avx512vl(auVar39,auVar92,auVar89);
      auVar40._4_4_ = auVar83._4_4_ * auVar89._4_4_;
      auVar40._0_4_ = auVar83._0_4_ * auVar89._0_4_;
      auVar40._8_4_ = auVar83._8_4_ * auVar89._8_4_;
      auVar40._12_4_ = auVar83._12_4_ * auVar89._12_4_;
      auVar40._16_4_ = auVar89._16_4_ * 0.0;
      auVar40._20_4_ = auVar89._20_4_ * 0.0;
      auVar40._24_4_ = auVar89._24_4_ * 0.0;
      auVar40._28_4_ = auVar89._28_4_;
      auVar8 = vfmsub231ps_fma(auVar40,ZEXT1632(auVar9),auVar93);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar85,auVar94);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar85,ZEXT1632(auVar7));
      auVar85 = ZEXT1632(auVar84);
      uVar72 = vcmpps_avx512vl(auVar93,auVar85,2);
      bVar70 = (byte)uVar72;
      fVar149 = (float)((uint)(bVar70 & 1) * auVar81._0_4_ |
                       (uint)!(bool)(bVar70 & 1) * auVar147._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar126 = (float)((uint)bVar69 * auVar81._4_4_ | (uint)!bVar69 * auVar147._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar128 = (float)((uint)bVar69 * auVar81._8_4_ | (uint)!bVar69 * auVar147._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar130 = (float)((uint)bVar69 * auVar81._12_4_ | (uint)!bVar69 * auVar147._12_4_);
      auVar102 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar149))));
      fVar78 = (float)((uint)(bVar70 & 1) * auVar82._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar150._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      fVar127 = (float)((uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * auVar150._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      fVar129 = (float)((uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * auVar150._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      fVar131 = (float)((uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * auVar150._12_4_);
      auVar101 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar78))));
      auVar107._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar151._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar69 * auVar90._4_4_ | (uint)!bVar69 * auVar151._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar69 * auVar90._8_4_ | (uint)!bVar69 * auVar151._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar69 * auVar90._12_4_ | (uint)!bVar69 * auVar151._12_4_);
      fVar167 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar90._16_4_);
      auVar107._16_4_ = fVar167;
      fVar140 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar90._20_4_);
      auVar107._20_4_ = fVar140;
      fVar141 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar90._24_4_);
      auVar107._24_4_ = fVar141;
      iVar2 = (uint)(byte)(uVar72 >> 7) * auVar90._28_4_;
      auVar107._28_4_ = iVar2;
      auVar89 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar91);
      auVar108._0_4_ = (uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar7._0_4_
      ;
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar108._4_4_ = (uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * auVar7._4_4_;
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar108._8_4_ = (uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * auVar7._8_4_;
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar108._12_4_ = (uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * auVar7._12_4_;
      auVar108._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar89._16_4_;
      auVar108._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar89._20_4_;
      auVar108._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar89._24_4_;
      auVar108._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar89._28_4_;
      auVar89 = vblendmps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar80));
      auVar109._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar82._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * auVar82._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * auVar82._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * auVar82._12_4_);
      fVar168 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar89._16_4_);
      auVar109._16_4_ = fVar168;
      fVar166 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar89._20_4_);
      auVar109._20_4_ = fVar166;
      fVar169 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar89._24_4_);
      auVar109._24_4_ = fVar169;
      auVar109._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar89._28_4_;
      auVar89 = vblendmps_avx512vl(auVar92,ZEXT1632(auVar79));
      auVar110._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar90._0_4_);
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar69 * auVar89._4_4_ | (uint)!bVar69 * auVar90._4_4_);
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar69 * auVar89._8_4_ | (uint)!bVar69 * auVar90._8_4_);
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar69 * auVar89._12_4_ | (uint)!bVar69 * auVar90._12_4_);
      bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar69 * auVar89._16_4_ | (uint)!bVar69 * auVar90._16_4_);
      bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar69 * auVar89._20_4_ | (uint)!bVar69 * auVar90._20_4_);
      bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar69 * auVar89._24_4_ | (uint)!bVar69 * auVar90._24_4_);
      bVar69 = SUB81(uVar72 >> 7,0);
      auVar110._28_4_ = (uint)bVar69 * auVar89._28_4_ | (uint)!bVar69 * auVar90._28_4_;
      auVar111._0_4_ =
           (uint)(bVar70 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar91._0_4_;
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar69 * (int)auVar9._4_4_ | (uint)!bVar69 * auVar91._4_4_;
      bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar69 * (int)auVar9._8_4_ | (uint)!bVar69 * auVar91._8_4_;
      bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar69 * (int)auVar9._12_4_ | (uint)!bVar69 * auVar91._12_4_;
      auVar111._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar91._16_4_;
      auVar111._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar91._20_4_;
      auVar111._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar91._24_4_;
      auVar111._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar91._28_4_;
      bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar72 >> 2) & 1);
      bVar17 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar112._0_4_ =
           (uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar79._0_4_;
      bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar14 * auVar92._4_4_ | (uint)!bVar14 * auVar79._4_4_;
      bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar14 * auVar92._8_4_ | (uint)!bVar14 * auVar79._8_4_;
      bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar14 * auVar92._12_4_ | (uint)!bVar14 * auVar79._12_4_;
      auVar112._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar92._16_4_;
      auVar112._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar92._20_4_;
      auVar112._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar92._24_4_;
      iVar3 = (uint)(byte)(uVar72 >> 7) * auVar92._28_4_;
      auVar112._28_4_ = iVar3;
      auVar95 = vsubps_avx512vl(auVar111,auVar102);
      auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar83._12_4_ |
                                              (uint)!bVar17 * auVar80._12_4_,
                                              CONCAT48((uint)bVar15 * (int)auVar83._8_4_ |
                                                       (uint)!bVar15 * auVar80._8_4_,
                                                       CONCAT44((uint)bVar69 * (int)auVar83._4_4_ |
                                                                (uint)!bVar69 * auVar80._4_4_,
                                                                (uint)(bVar70 & 1) *
                                                                (int)auVar83._0_4_ |
                                                                (uint)!(bool)(bVar70 & 1) *
                                                                auVar80._0_4_)))),auVar101);
      auVar90 = vsubps_avx(auVar112,auVar107);
      auVar91 = vsubps_avx(auVar102,auVar108);
      auVar92 = vsubps_avx(auVar101,auVar109);
      auVar94 = vsubps_avx(auVar107,auVar110);
      auVar41._4_4_ = auVar90._4_4_ * fVar126;
      auVar41._0_4_ = auVar90._0_4_ * fVar149;
      auVar41._8_4_ = auVar90._8_4_ * fVar128;
      auVar41._12_4_ = auVar90._12_4_ * fVar130;
      auVar41._16_4_ = auVar90._16_4_ * 0.0;
      auVar41._20_4_ = auVar90._20_4_ * 0.0;
      auVar41._24_4_ = auVar90._24_4_ * 0.0;
      auVar41._28_4_ = iVar3;
      auVar81 = vfmsub231ps_fma(auVar41,auVar107,auVar95);
      auVar42._4_4_ = fVar127 * auVar95._4_4_;
      auVar42._0_4_ = fVar78 * auVar95._0_4_;
      auVar42._8_4_ = fVar129 * auVar95._8_4_;
      auVar42._12_4_ = fVar131 * auVar95._12_4_;
      auVar42._16_4_ = auVar95._16_4_ * 0.0;
      auVar42._20_4_ = auVar95._20_4_ * 0.0;
      auVar42._24_4_ = auVar95._24_4_ * 0.0;
      auVar42._28_4_ = auVar93._28_4_;
      auVar82 = vfmsub231ps_fma(auVar42,auVar102,auVar89);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar85,ZEXT1632(auVar81));
      auVar156._0_4_ = auVar89._0_4_ * auVar107._0_4_;
      auVar156._4_4_ = auVar89._4_4_ * auVar107._4_4_;
      auVar156._8_4_ = auVar89._8_4_ * auVar107._8_4_;
      auVar156._12_4_ = auVar89._12_4_ * auVar107._12_4_;
      auVar156._16_4_ = auVar89._16_4_ * fVar167;
      auVar156._20_4_ = auVar89._20_4_ * fVar140;
      auVar156._24_4_ = auVar89._24_4_ * fVar141;
      auVar156._28_4_ = 0;
      auVar81 = vfmsub231ps_fma(auVar156,auVar101,auVar90);
      auVar96 = vfmadd231ps_avx512vl(auVar93,auVar85,ZEXT1632(auVar81));
      auVar93 = vmulps_avx512vl(auVar94,auVar108);
      auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar110);
      auVar43._4_4_ = auVar92._4_4_ * auVar110._4_4_;
      auVar43._0_4_ = auVar92._0_4_ * auVar110._0_4_;
      auVar43._8_4_ = auVar92._8_4_ * auVar110._8_4_;
      auVar43._12_4_ = auVar92._12_4_ * auVar110._12_4_;
      auVar43._16_4_ = auVar92._16_4_ * auVar110._16_4_;
      auVar43._20_4_ = auVar92._20_4_ * auVar110._20_4_;
      auVar43._24_4_ = auVar92._24_4_ * auVar110._24_4_;
      auVar43._28_4_ = auVar110._28_4_;
      auVar81 = vfmsub231ps_fma(auVar43,auVar109,auVar94);
      auVar157._0_4_ = auVar109._0_4_ * auVar91._0_4_;
      auVar157._4_4_ = auVar109._4_4_ * auVar91._4_4_;
      auVar157._8_4_ = auVar109._8_4_ * auVar91._8_4_;
      auVar157._12_4_ = auVar109._12_4_ * auVar91._12_4_;
      auVar157._16_4_ = fVar168 * auVar91._16_4_;
      auVar157._20_4_ = fVar166 * auVar91._20_4_;
      auVar157._24_4_ = fVar169 * auVar91._24_4_;
      auVar157._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar157,auVar92,auVar108);
      auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar85,auVar93);
      auVar87 = vfmadd231ps_avx512vl(auVar93,auVar85,ZEXT1632(auVar81));
      auVar93 = vmaxps_avx(auVar96,auVar87);
      uVar143 = vcmpps_avx512vl(auVar93,auVar85,2);
      bVar77 = bVar77 & (byte)uVar143;
      auVar185 = ZEXT3264(local_4a0);
      auVar186 = ZEXT3264(local_4c0);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar191 = ZEXT3264(auVar88);
      auVar187 = ZEXT3264(local_4e0);
      auVar182 = ZEXT3264(local_620);
      if (bVar77 == 0) {
        bVar69 = false;
        auVar188 = ZEXT3264(local_5a0);
        auVar189 = ZEXT3264(local_5c0);
        auVar190 = ZEXT3264(local_5e0);
      }
      else {
        auVar44._4_4_ = auVar94._4_4_ * auVar89._4_4_;
        auVar44._0_4_ = auVar94._0_4_ * auVar89._0_4_;
        auVar44._8_4_ = auVar94._8_4_ * auVar89._8_4_;
        auVar44._12_4_ = auVar94._12_4_ * auVar89._12_4_;
        auVar44._16_4_ = auVar94._16_4_ * auVar89._16_4_;
        auVar44._20_4_ = auVar94._20_4_ * auVar89._20_4_;
        auVar44._24_4_ = auVar94._24_4_ * auVar89._24_4_;
        auVar44._28_4_ = auVar93._28_4_;
        auVar80 = vfmsub231ps_fma(auVar44,auVar92,auVar90);
        auVar45._4_4_ = auVar90._4_4_ * auVar91._4_4_;
        auVar45._0_4_ = auVar90._0_4_ * auVar91._0_4_;
        auVar45._8_4_ = auVar90._8_4_ * auVar91._8_4_;
        auVar45._12_4_ = auVar90._12_4_ * auVar91._12_4_;
        auVar45._16_4_ = auVar90._16_4_ * auVar91._16_4_;
        auVar45._20_4_ = auVar90._20_4_ * auVar91._20_4_;
        auVar45._24_4_ = auVar90._24_4_ * auVar91._24_4_;
        auVar45._28_4_ = auVar90._28_4_;
        auVar82 = vfmsub231ps_fma(auVar45,auVar95,auVar94);
        auVar46._4_4_ = auVar92._4_4_ * auVar95._4_4_;
        auVar46._0_4_ = auVar92._0_4_ * auVar95._0_4_;
        auVar46._8_4_ = auVar92._8_4_ * auVar95._8_4_;
        auVar46._12_4_ = auVar92._12_4_ * auVar95._12_4_;
        auVar46._16_4_ = auVar92._16_4_ * auVar95._16_4_;
        auVar46._20_4_ = auVar92._20_4_ * auVar95._20_4_;
        auVar46._24_4_ = auVar92._24_4_ * auVar95._24_4_;
        auVar46._28_4_ = auVar92._28_4_;
        auVar79 = vfmsub231ps_fma(auVar46,auVar91,auVar89);
        auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar82),ZEXT1632(auVar79));
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar80),auVar85);
        auVar89 = vrcp14ps_avx512vl(auVar93);
        auVar90 = vfnmadd213ps_avx512vl(auVar89,auVar93,auVar88);
        auVar81 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
        auVar47._4_4_ = auVar79._4_4_ * auVar107._4_4_;
        auVar47._0_4_ = auVar79._0_4_ * auVar107._0_4_;
        auVar47._8_4_ = auVar79._8_4_ * auVar107._8_4_;
        auVar47._12_4_ = auVar79._12_4_ * auVar107._12_4_;
        auVar47._16_4_ = fVar167 * 0.0;
        auVar47._20_4_ = fVar140 * 0.0;
        auVar47._24_4_ = fVar141 * 0.0;
        auVar47._28_4_ = iVar2;
        auVar82 = vfmadd231ps_fma(auVar47,auVar101,ZEXT1632(auVar82));
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar102,ZEXT1632(auVar80));
        fVar140 = auVar81._0_4_;
        fVar141 = auVar81._4_4_;
        fVar167 = auVar81._8_4_;
        fVar169 = auVar81._12_4_;
        local_3a0 = ZEXT1632(CONCAT412(auVar82._12_4_ * fVar169,
                                       CONCAT48(auVar82._8_4_ * fVar167,
                                                CONCAT44(auVar82._4_4_ * fVar141,
                                                         auVar82._0_4_ * fVar140))));
        auVar171._4_4_ = uVar134;
        auVar171._0_4_ = uVar134;
        auVar171._8_4_ = uVar134;
        auVar171._12_4_ = uVar134;
        auVar171._16_4_ = uVar134;
        auVar171._20_4_ = uVar134;
        auVar171._24_4_ = uVar134;
        auVar171._28_4_ = uVar134;
        uVar143 = vcmpps_avx512vl(auVar171,local_3a0,2);
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar26._4_4_ = uVar4;
        auVar26._0_4_ = uVar4;
        auVar26._8_4_ = uVar4;
        auVar26._12_4_ = uVar4;
        auVar26._16_4_ = uVar4;
        auVar26._20_4_ = uVar4;
        auVar26._24_4_ = uVar4;
        auVar26._28_4_ = uVar4;
        uVar21 = vcmpps_avx512vl(local_3a0,auVar26,2);
        bVar77 = (byte)uVar143 & (byte)uVar21 & bVar77;
        auVar188 = ZEXT3264(local_5a0);
        auVar189 = ZEXT3264(local_5c0);
        auVar190 = ZEXT3264(local_5e0);
        if (bVar77 != 0) {
          uVar143 = vcmpps_avx512vl(auVar93,auVar85,4);
          bVar77 = bVar77 & (byte)uVar143;
          if (bVar77 != 0) {
            fVar166 = auVar96._0_4_ * fVar140;
            fVar168 = auVar96._4_4_ * fVar141;
            auVar48._4_4_ = fVar168;
            auVar48._0_4_ = fVar166;
            fVar149 = auVar96._8_4_ * fVar167;
            auVar48._8_4_ = fVar149;
            fVar78 = auVar96._12_4_ * fVar169;
            auVar48._12_4_ = fVar78;
            fVar126 = auVar96._16_4_ * 0.0;
            auVar48._16_4_ = fVar126;
            fVar127 = auVar96._20_4_ * 0.0;
            auVar48._20_4_ = fVar127;
            fVar128 = auVar96._24_4_ * 0.0;
            auVar48._24_4_ = fVar128;
            auVar48._28_4_ = auVar93._28_4_;
            auVar89 = vsubps_avx512vl(auVar88,auVar48);
            local_3e0._0_4_ =
                 (float)((uint)(bVar70 & 1) * (int)fVar166 |
                        (uint)!(bool)(bVar70 & 1) * auVar89._0_4_);
            bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
            local_3e0._4_4_ = (float)((uint)bVar69 * (int)fVar168 | (uint)!bVar69 * auVar89._4_4_);
            bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
            local_3e0._8_4_ = (float)((uint)bVar69 * (int)fVar149 | (uint)!bVar69 * auVar89._8_4_);
            bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
            local_3e0._12_4_ = (float)((uint)bVar69 * (int)fVar78 | (uint)!bVar69 * auVar89._12_4_);
            bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
            local_3e0._16_4_ = (float)((uint)bVar69 * (int)fVar126 | (uint)!bVar69 * auVar89._16_4_)
            ;
            bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
            local_3e0._20_4_ = (float)((uint)bVar69 * (int)fVar127 | (uint)!bVar69 * auVar89._20_4_)
            ;
            bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
            local_3e0._24_4_ = (float)((uint)bVar69 * (int)fVar128 | (uint)!bVar69 * auVar89._24_4_)
            ;
            bVar69 = SUB81(uVar72 >> 7,0);
            local_3e0._28_4_ =
                 (float)((uint)bVar69 * auVar93._28_4_ | (uint)!bVar69 * auVar89._28_4_);
            auVar93 = vsubps_avx(ZEXT1632(auVar10),auVar98);
            auVar81 = vfmadd213ps_fma(auVar93,local_3e0,auVar98);
            uVar4 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar27._4_4_ = uVar4;
            auVar27._0_4_ = uVar4;
            auVar27._8_4_ = uVar4;
            auVar27._12_4_ = uVar4;
            auVar27._16_4_ = uVar4;
            auVar27._20_4_ = uVar4;
            auVar27._24_4_ = uVar4;
            auVar27._28_4_ = uVar4;
            auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                         CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                  CONCAT44(auVar81._4_4_ +
                                                                           auVar81._4_4_,
                                                                           auVar81._0_4_ +
                                                                           auVar81._0_4_)))),auVar27
                                     );
            uVar143 = vcmpps_avx512vl(local_3a0,auVar93,6);
            if (((byte)uVar143 & bVar77) != 0) {
              auVar152._0_4_ = auVar87._0_4_ * fVar140;
              auVar152._4_4_ = auVar87._4_4_ * fVar141;
              auVar152._8_4_ = auVar87._8_4_ * fVar167;
              auVar152._12_4_ = auVar87._12_4_ * fVar169;
              auVar152._16_4_ = auVar87._16_4_ * 0.0;
              auVar152._20_4_ = auVar87._20_4_ * 0.0;
              auVar152._24_4_ = auVar87._24_4_ * 0.0;
              auVar152._28_4_ = 0;
              auVar93 = vsubps_avx512vl(auVar88,auVar152);
              auVar113._0_4_ =
                   (uint)(bVar70 & 1) * (int)auVar152._0_4_ |
                   (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
              bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar113._4_4_ = (uint)bVar69 * (int)auVar152._4_4_ | (uint)!bVar69 * auVar93._4_4_;
              bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar113._8_4_ = (uint)bVar69 * (int)auVar152._8_4_ | (uint)!bVar69 * auVar93._8_4_;
              bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar113._12_4_ = (uint)bVar69 * (int)auVar152._12_4_ | (uint)!bVar69 * auVar93._12_4_
              ;
              bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar113._16_4_ = (uint)bVar69 * (int)auVar152._16_4_ | (uint)!bVar69 * auVar93._16_4_
              ;
              bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar113._20_4_ = (uint)bVar69 * (int)auVar152._20_4_ | (uint)!bVar69 * auVar93._20_4_
              ;
              bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar113._24_4_ = (uint)bVar69 * (int)auVar152._24_4_ | (uint)!bVar69 * auVar93._24_4_
              ;
              auVar113._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar93._28_4_;
              auVar28._8_4_ = 0x40000000;
              auVar28._0_8_ = 0x4000000040000000;
              auVar28._12_4_ = 0x40000000;
              auVar28._16_4_ = 0x40000000;
              auVar28._20_4_ = 0x40000000;
              auVar28._24_4_ = 0x40000000;
              auVar28._28_4_ = 0x40000000;
              local_3c0 = vfmsub132ps_avx512vl(auVar113,auVar88,auVar28);
              local_380 = 0;
              local_360 = local_5f0._0_8_;
              uStack_358 = local_5f0._8_8_;
              local_350 = local_600._0_8_;
              uStack_348 = local_600._8_8_;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar69 = true, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_019eecfe;
                fVar133 = 1.0 / fVar133;
                local_320[0] = fVar133 * (local_3e0._0_4_ + 0.0);
                local_320[1] = fVar133 * (local_3e0._4_4_ + 1.0);
                local_320[2] = fVar133 * (local_3e0._8_4_ + 2.0);
                local_320[3] = fVar133 * (local_3e0._12_4_ + 3.0);
                fStack_310 = fVar133 * (local_3e0._16_4_ + 4.0);
                fStack_30c = fVar133 * (local_3e0._20_4_ + 5.0);
                fStack_308 = fVar133 * (local_3e0._24_4_ + 6.0);
                fStack_304 = local_3e0._28_4_ + 7.0;
                local_300 = local_3c0;
                local_2e0 = local_3a0;
                local_520 = (float)(uint)((byte)uVar143 & bVar77);
                lVar75 = 0;
                for (uVar72 = (ulong)(uint)local_520; (uVar72 & 1) == 0;
                    uVar72 = uVar72 >> 1 | 0x8000000000000000) {
                  lVar75 = lVar75 + 1;
                }
                local_480._0_8_ = lVar75;
                _local_400 = vpbroadcastd_avx512vl();
                uVar72 = (ulong)(uint)local_520;
                local_37c = iVar22;
                local_370 = auVar20;
                while (auVar81 = auVar184._0_16_, uVar72 != 0) {
                  local_520 = (float)uVar72;
                  fStack_51c = (float)(uVar72 >> 0x20);
                  local_440 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar133 = local_320[local_480._0_8_];
                  auVar144._4_4_ = fVar133;
                  auVar144._0_4_ = fVar133;
                  auVar144._8_4_ = fVar133;
                  auVar144._12_4_ = fVar133;
                  local_220._16_4_ = fVar133;
                  local_220._0_16_ = auVar144;
                  local_220._20_4_ = fVar133;
                  local_220._24_4_ = fVar133;
                  local_220._28_4_ = fVar133;
                  local_200 = *(undefined4 *)(local_300 + local_480._0_8_ * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)(local_2e0 + local_480._0_8_ * 4);
                  local_650.context = context->user;
                  fVar140 = 1.0 - fVar133;
                  auVar24._8_4_ = 0x80000000;
                  auVar24._0_8_ = 0x8000000080000000;
                  auVar24._12_4_ = 0x80000000;
                  auVar79 = vxorps_avx512vl(ZEXT416((uint)fVar140),auVar24);
                  auVar82 = ZEXT416((uint)(fVar133 * fVar140 * 4.0));
                  auVar80 = vfnmsub213ss_fma(auVar144,auVar144,auVar82);
                  auVar82 = vfmadd213ss_fma(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),auVar82);
                  fVar140 = fVar140 * auVar79._0_4_ * 0.5;
                  fVar141 = auVar80._0_4_ * 0.5;
                  fVar167 = auVar82._0_4_ * 0.5;
                  fVar133 = fVar133 * fVar133 * 0.5;
                  auVar162._0_4_ = fVar133 * (float)local_450._0_4_;
                  auVar162._4_4_ = fVar133 * (float)local_450._4_4_;
                  auVar162._8_4_ = fVar133 * fStack_448;
                  auVar162._12_4_ = fVar133 * fStack_444;
                  auVar135._4_4_ = fVar167;
                  auVar135._0_4_ = fVar167;
                  auVar135._8_4_ = fVar167;
                  auVar135._12_4_ = fVar167;
                  auVar82 = vfmadd132ps_fma(auVar135,auVar162,local_600);
                  auVar154._4_4_ = fVar141;
                  auVar154._0_4_ = fVar141;
                  auVar154._8_4_ = fVar141;
                  auVar154._12_4_ = fVar141;
                  auVar82 = vfmadd132ps_fma(auVar154,auVar82,local_5f0);
                  auVar136._4_4_ = fVar140;
                  auVar136._0_4_ = fVar140;
                  auVar136._8_4_ = fVar140;
                  auVar136._12_4_ = fVar140;
                  auVar82 = vfmadd213ps_fma(auVar136,auVar20,auVar82);
                  local_280 = auVar82._0_4_;
                  auVar158._8_4_ = 1;
                  auVar158._0_8_ = 0x100000001;
                  auVar158._12_4_ = 1;
                  auVar158._16_4_ = 1;
                  auVar158._20_4_ = 1;
                  auVar158._24_4_ = 1;
                  auVar158._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar158,ZEXT1632(auVar82));
                  auVar164._8_4_ = 2;
                  auVar164._0_8_ = 0x200000002;
                  auVar164._12_4_ = 2;
                  auVar164._16_4_ = 2;
                  auVar164._20_4_ = 2;
                  auVar164._24_4_ = 2;
                  auVar164._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar164,ZEXT1632(auVar82));
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_2a0._0_8_;
                  uStack_1d8 = local_2a0._8_8_;
                  uStack_1d0 = local_2a0._16_8_;
                  uStack_1c8 = local_2a0._24_8_;
                  local_1c0 = _local_400;
                  vpcmpeqd_avx2(_local_400,_local_400);
                  local_1a0 = (local_650.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_650.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_560 = local_2c0;
                  local_650.valid = (int *)local_560;
                  local_650.geometryUserPtr = pGVar12->userPtr;
                  local_650.hit = (RTCHitN *)&local_280;
                  local_650.N = 8;
                  local_650.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_650);
                    auVar190 = ZEXT3264(local_5e0);
                    auVar189 = ZEXT3264(local_5c0);
                    auVar188 = ZEXT3264(local_5a0);
                    auVar182 = ZEXT3264(local_620);
                    auVar183 = ZEXT3264(local_500);
                    auVar187 = ZEXT3264(local_4e0);
                    auVar186 = ZEXT3264(local_4c0);
                    auVar185 = ZEXT3264(local_4a0);
                    auVar81 = vxorps_avx512vl(auVar81,auVar81);
                    auVar184 = ZEXT1664(auVar81);
                    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar191 = ZEXT3264(auVar93);
                  }
                  auVar81 = auVar184._0_16_;
                  if (local_560 != (undefined1  [32])0x0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_650);
                      auVar190 = ZEXT3264(local_5e0);
                      auVar189 = ZEXT3264(local_5c0);
                      auVar188 = ZEXT3264(local_5a0);
                      auVar182 = ZEXT3264(local_620);
                      auVar183 = ZEXT3264(local_500);
                      auVar187 = ZEXT3264(local_4e0);
                      auVar186 = ZEXT3264(local_4c0);
                      auVar185 = ZEXT3264(local_4a0);
                      auVar81 = vxorps_avx512vl(auVar81,auVar81);
                      auVar184 = ZEXT1664(auVar81);
                      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar191 = ZEXT3264(auVar93);
                    }
                    uVar72 = vptestmd_avx512vl(local_560,local_560);
                    auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar69 = (bool)((byte)uVar72 & 1);
                    auVar114._0_4_ =
                         (uint)bVar69 * auVar93._0_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x100);
                    bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
                    auVar114._4_4_ =
                         (uint)bVar69 * auVar93._4_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x104);
                    bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
                    auVar114._8_4_ =
                         (uint)bVar69 * auVar93._8_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x108);
                    bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
                    auVar114._12_4_ =
                         (uint)bVar69 * auVar93._12_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x10c);
                    bVar69 = (bool)((byte)(uVar72 >> 4) & 1);
                    auVar114._16_4_ =
                         (uint)bVar69 * auVar93._16_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x110);
                    bVar69 = (bool)((byte)(uVar72 >> 5) & 1);
                    auVar114._20_4_ =
                         (uint)bVar69 * auVar93._20_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x114);
                    bVar69 = (bool)((byte)(uVar72 >> 6) & 1);
                    auVar114._24_4_ =
                         (uint)bVar69 * auVar93._24_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x118);
                    bVar69 = SUB81(uVar72 >> 7,0);
                    auVar114._28_4_ =
                         (uint)bVar69 * auVar93._28_4_ |
                         (uint)!bVar69 * *(int *)(local_650.ray + 0x11c);
                    *(undefined1 (*) [32])(local_650.ray + 0x100) = auVar114;
                    if (local_560 != (undefined1  [32])0x0) {
                      bVar69 = true;
                      goto LAB_019eecfe;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = local_440;
                  lVar75 = 0;
                  uVar72 = CONCAT44(fStack_51c,local_520) ^ 1L << (local_480._0_8_ & 0x3f);
                  for (uVar23 = uVar72; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000
                      ) {
                    lVar75 = lVar75 + 1;
                  }
                  local_480._0_8_ = lVar75;
                }
              }
            }
          }
        }
        bVar69 = false;
      }
    }
LAB_019eecfe:
    if (8 < iVar22) {
      local_480 = vpbroadcastd_avx512vl();
      local_400._4_4_ = 1.0 / (float)local_420._0_4_;
      local_400._0_4_ = local_400._4_4_;
      fStack_3f8 = (float)local_400._4_4_;
      fStack_3f4 = (float)local_400._4_4_;
      fStack_3f0 = (float)local_400._4_4_;
      fStack_3ec = (float)local_400._4_4_;
      fStack_3e8 = (float)local_400._4_4_;
      fStack_3e4 = (float)local_400._4_4_;
      local_420 = vpbroadcastd_avx512vl();
      local_520 = fVar142;
      fStack_51c = fVar142;
      fStack_518 = fVar142;
      fStack_514 = fVar142;
      fStack_510 = fVar142;
      fStack_50c = fVar142;
      fStack_508 = fVar142;
      fStack_504 = fVar142;
      local_440 = uVar134;
      uStack_43c = uVar134;
      uStack_438 = uVar134;
      uStack_434 = uVar134;
      uStack_430 = uVar134;
      uStack_42c = uVar134;
      uStack_428 = uVar134;
      uStack_424 = uVar134;
      for (lVar75 = 8; lVar75 < local_530; lVar75 = lVar75 + 8) {
        auVar93 = vpbroadcastd_avx512vl();
        auVar92 = vpor_avx2(auVar93,_DAT_01fb4ba0);
        uVar21 = vpcmpd_avx512vl(auVar92,local_480,1);
        auVar93 = *(undefined1 (*) [32])(bspline_basis0 + lVar75 * 4 + lVar76);
        auVar89 = *(undefined1 (*) [32])(lVar76 + 0x21fffac + lVar75 * 4);
        auVar90 = *(undefined1 (*) [32])(lVar76 + 0x2200430 + lVar75 * 4);
        auVar91 = *(undefined1 (*) [32])(lVar76 + 0x22008b4 + lVar75 * 4);
        local_5c0 = auVar189._0_32_;
        auVar94 = vmulps_avx512vl(local_5c0,auVar91);
        local_5e0 = auVar190._0_32_;
        auVar102 = vmulps_avx512vl(local_5e0,auVar91);
        auVar49._4_4_ = auVar91._4_4_ * (float)local_100._4_4_;
        auVar49._0_4_ = auVar91._0_4_ * (float)local_100._0_4_;
        auVar49._8_4_ = auVar91._8_4_ * fStack_f8;
        auVar49._12_4_ = auVar91._12_4_ * fStack_f4;
        auVar49._16_4_ = auVar91._16_4_ * fStack_f0;
        auVar49._20_4_ = auVar91._20_4_ * fStack_ec;
        auVar49._24_4_ = auVar91._24_4_ * fStack_e8;
        auVar49._28_4_ = auVar92._28_4_;
        auVar87 = auVar182._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar87);
        local_5a0 = auVar188._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar102,auVar90,local_5a0);
        auVar102 = vfmadd231ps_avx512vl(auVar49,auVar90,local_e0);
        auVar178 = auVar187._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar178);
        auVar170 = auVar183._0_32_;
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar170);
        auVar81 = vfmadd231ps_fma(auVar102,auVar89,local_c0);
        local_4a0 = auVar185._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar92,auVar93,local_4a0);
        auVar177 = auVar186._0_32_;
        auVar85 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar177);
        auVar92 = *(undefined1 (*) [32])(bspline_basis1 + lVar75 * 4 + lVar76);
        auVar94 = *(undefined1 (*) [32])(lVar76 + 0x22023cc + lVar75 * 4);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar93,local_a0);
        auVar102 = *(undefined1 (*) [32])(lVar76 + 0x2202850 + lVar75 * 4);
        auVar101 = *(undefined1 (*) [32])(lVar76 + 0x2202cd4 + lVar75 * 4);
        auVar95 = vmulps_avx512vl(local_5c0,auVar101);
        auVar96 = vmulps_avx512vl(local_5e0,auVar101);
        auVar50._4_4_ = auVar101._4_4_ * (float)local_100._4_4_;
        auVar50._0_4_ = auVar101._0_4_ * (float)local_100._0_4_;
        auVar50._8_4_ = auVar101._8_4_ * fStack_f8;
        auVar50._12_4_ = auVar101._12_4_ * fStack_f4;
        auVar50._16_4_ = auVar101._16_4_ * fStack_f0;
        auVar50._20_4_ = auVar101._20_4_ * fStack_ec;
        auVar50._24_4_ = auVar101._24_4_ * fStack_e8;
        auVar50._28_4_ = uStack_e4;
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar87);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_5a0);
        auVar86 = vfmadd231ps_avx512vl(auVar50,auVar102,local_e0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar178);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar170);
        auVar82 = vfmadd231ps_fma(auVar86,auVar94,local_c0);
        auVar86 = vfmadd231ps_avx512vl(auVar95,auVar92,local_4a0);
        auVar97 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar177);
        auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar92,local_a0);
        auVar98 = vmaxps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar82));
        auVar95 = vsubps_avx(auVar86,auVar88);
        auVar96 = vsubps_avx(auVar97,auVar85);
        auVar99 = vmulps_avx512vl(auVar85,auVar95);
        auVar100 = vmulps_avx512vl(auVar88,auVar96);
        auVar99 = vsubps_avx512vl(auVar99,auVar100);
        auVar100 = vmulps_avx512vl(auVar96,auVar96);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar95);
        auVar98 = vmulps_avx512vl(auVar98,auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar100);
        auVar99 = vmulps_avx512vl(auVar99,auVar99);
        uVar143 = vcmpps_avx512vl(auVar99,auVar98,2);
        bVar77 = (byte)uVar21 & (byte)uVar143;
        if (bVar77 == 0) {
LAB_019ef79e:
          auVar183 = ZEXT3264(auVar170);
          auVar182 = ZEXT3264(auVar87);
        }
        else {
          auVar101 = vmulps_avx512vl(local_580,auVar101);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar101);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar102);
          auVar92 = vfmadd213ps_avx512vl(auVar92,local_120,auVar94);
          auVar91 = vmulps_avx512vl(local_580,auVar91);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_160,auVar91);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
          auVar94 = vfmadd213ps_avx512vl(auVar93,local_120,auVar89);
          auVar93 = *(undefined1 (*) [32])(lVar76 + 0x2200d38 + lVar75 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar76 + 0x22011bc + lVar75 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar76 + 0x2201640 + lVar75 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar76 + 0x2201ac4 + lVar75 * 4);
          auVar102 = vmulps_avx512vl(local_5c0,auVar91);
          auVar101 = vmulps_avx512vl(local_5e0,auVar91);
          auVar91 = vmulps_avx512vl(local_580,auVar91);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar87);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar90,local_5a0);
          auVar90 = vfmadd231ps_avx512vl(auVar91,local_160,auVar90);
          auVar91 = vfmadd231ps_avx512vl(auVar102,auVar89,auVar178);
          auVar102 = vfmadd231ps_avx512vl(auVar101,auVar89,auVar170);
          auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar93,local_4a0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,auVar177);
          auVar101 = vfmadd231ps_avx512vl(auVar89,local_120,auVar93);
          auVar93 = *(undefined1 (*) [32])(lVar76 + 0x2203158 + lVar75 * 4);
          auVar89 = *(undefined1 (*) [32])(lVar76 + 0x2203a60 + lVar75 * 4);
          auVar90 = *(undefined1 (*) [32])(lVar76 + 0x2203ee4 + lVar75 * 4);
          auVar98 = vmulps_avx512vl(local_5c0,auVar90);
          auVar99 = vmulps_avx512vl(local_5e0,auVar90);
          auVar90 = vmulps_avx512vl(local_580,auVar90);
          auVar87 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar87);
          auVar98 = vfmadd231ps_avx512vl(auVar99,auVar89,local_5a0);
          auVar90 = vfmadd231ps_avx512vl(auVar90,local_160,auVar89);
          auVar89 = *(undefined1 (*) [32])(lVar76 + 0x22035dc + lVar75 * 4);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar89,auVar178);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,auVar170);
          auVar89 = vfmadd231ps_avx512vl(auVar90,local_140,auVar89);
          auVar90 = vfmadd231ps_avx512vl(auVar87,auVar93,local_4a0);
          auVar87 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar177);
          auVar89 = vfmadd231ps_avx512vl(auVar89,local_120,auVar93);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar91,auVar98);
          vandps_avx512vl(auVar102,auVar98);
          auVar93 = vmaxps_avx(auVar98,auVar98);
          vandps_avx512vl(auVar101,auVar98);
          auVar93 = vmaxps_avx(auVar93,auVar98);
          auVar67._4_4_ = fStack_51c;
          auVar67._0_4_ = local_520;
          auVar67._8_4_ = fStack_518;
          auVar67._12_4_ = fStack_514;
          auVar67._16_4_ = fStack_510;
          auVar67._20_4_ = fStack_50c;
          auVar67._24_4_ = fStack_508;
          auVar67._28_4_ = fStack_504;
          uVar72 = vcmpps_avx512vl(auVar93,auVar67,1);
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar115._0_4_ = (float)((uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar91._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar91._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar91._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar91._12_4_);
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar91._16_4_);
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar91._20_4_);
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar91._24_4_);
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar115._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar91._28_4_;
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar116._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar102._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar102._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar102._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar102._12_4_)
          ;
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar116._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar102._16_4_)
          ;
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar116._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar102._20_4_)
          ;
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar116._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar102._24_4_)
          ;
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar116._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar102._28_4_;
          vandps_avx512vl(auVar90,auVar98);
          vandps_avx512vl(auVar87,auVar98);
          auVar93 = vmaxps_avx(auVar116,auVar116);
          vandps_avx512vl(auVar89,auVar98);
          auVar93 = vmaxps_avx(auVar93,auVar116);
          uVar72 = vcmpps_avx512vl(auVar93,auVar67,1);
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar117._0_4_ = (uint)bVar14 * auVar95._0_4_ | (uint)!bVar14 * auVar90._0_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar14 * auVar95._4_4_ | (uint)!bVar14 * auVar90._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar14 * auVar95._8_4_ | (uint)!bVar14 * auVar90._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar14 * auVar95._12_4_ | (uint)!bVar14 * auVar90._12_4_;
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar117._16_4_ = (uint)bVar14 * auVar95._16_4_ | (uint)!bVar14 * auVar90._16_4_;
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar117._20_4_ = (uint)bVar14 * auVar95._20_4_ | (uint)!bVar14 * auVar90._20_4_;
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar117._24_4_ = (uint)bVar14 * auVar95._24_4_ | (uint)!bVar14 * auVar90._24_4_;
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar117._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar90._28_4_;
          bVar14 = (bool)((byte)uVar72 & 1);
          auVar118._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar87._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar87._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar87._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar87._12_4_);
          bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar118._16_4_ = (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar87._16_4_);
          bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar118._20_4_ = (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar87._20_4_);
          bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar118._24_4_ = (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar87._24_4_);
          bVar14 = SUB81(uVar72 >> 7,0);
          auVar118._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar87._28_4_;
          auVar173._8_4_ = 0x80000000;
          auVar173._0_8_ = 0x8000000080000000;
          auVar173._12_4_ = 0x80000000;
          auVar173._16_4_ = 0x80000000;
          auVar173._20_4_ = 0x80000000;
          auVar173._24_4_ = 0x80000000;
          auVar173._28_4_ = 0x80000000;
          auVar93 = vxorps_avx512vl(auVar117,auVar173);
          auVar98 = auVar184._0_32_;
          auVar89 = vfmadd213ps_avx512vl(auVar115,auVar115,auVar98);
          auVar80 = vfmadd231ps_fma(auVar89,auVar116,auVar116);
          auVar89 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
          auVar181._8_4_ = 0xbf000000;
          auVar181._0_8_ = 0xbf000000bf000000;
          auVar181._12_4_ = 0xbf000000;
          auVar181._16_4_ = 0xbf000000;
          auVar181._20_4_ = 0xbf000000;
          auVar181._24_4_ = 0xbf000000;
          auVar181._28_4_ = 0xbf000000;
          fVar142 = auVar89._0_4_;
          fVar133 = auVar89._4_4_;
          fVar140 = auVar89._8_4_;
          fVar141 = auVar89._12_4_;
          fVar167 = auVar89._16_4_;
          fVar169 = auVar89._20_4_;
          fVar166 = auVar89._24_4_;
          auVar51._4_4_ = fVar133 * fVar133 * fVar133 * auVar80._4_4_ * -0.5;
          auVar51._0_4_ = fVar142 * fVar142 * fVar142 * auVar80._0_4_ * -0.5;
          auVar51._8_4_ = fVar140 * fVar140 * fVar140 * auVar80._8_4_ * -0.5;
          auVar51._12_4_ = fVar141 * fVar141 * fVar141 * auVar80._12_4_ * -0.5;
          auVar51._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
          auVar51._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
          auVar51._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
          auVar51._28_4_ = auVar116._28_4_;
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar89 = vfmadd231ps_avx512vl(auVar51,auVar90,auVar89);
          auVar52._4_4_ = auVar116._4_4_ * auVar89._4_4_;
          auVar52._0_4_ = auVar116._0_4_ * auVar89._0_4_;
          auVar52._8_4_ = auVar116._8_4_ * auVar89._8_4_;
          auVar52._12_4_ = auVar116._12_4_ * auVar89._12_4_;
          auVar52._16_4_ = auVar116._16_4_ * auVar89._16_4_;
          auVar52._20_4_ = auVar116._20_4_ * auVar89._20_4_;
          auVar52._24_4_ = auVar116._24_4_ * auVar89._24_4_;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = auVar89._4_4_ * -auVar115._4_4_;
          auVar53._0_4_ = auVar89._0_4_ * -auVar115._0_4_;
          auVar53._8_4_ = auVar89._8_4_ * -auVar115._8_4_;
          auVar53._12_4_ = auVar89._12_4_ * -auVar115._12_4_;
          auVar53._16_4_ = auVar89._16_4_ * -auVar115._16_4_;
          auVar53._20_4_ = auVar89._20_4_ * -auVar115._20_4_;
          auVar53._24_4_ = auVar89._24_4_ * -auVar115._24_4_;
          auVar53._28_4_ = auVar116._28_4_;
          auVar91 = vmulps_avx512vl(auVar89,auVar98);
          auVar89 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar98);
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar118,auVar118);
          auVar102 = vrsqrt14ps_avx512vl(auVar89);
          auVar89 = vmulps_avx512vl(auVar89,auVar181);
          fVar142 = auVar102._0_4_;
          fVar133 = auVar102._4_4_;
          fVar140 = auVar102._8_4_;
          fVar141 = auVar102._12_4_;
          fVar167 = auVar102._16_4_;
          fVar169 = auVar102._20_4_;
          fVar166 = auVar102._24_4_;
          auVar54._4_4_ = fVar133 * fVar133 * fVar133 * auVar89._4_4_;
          auVar54._0_4_ = fVar142 * fVar142 * fVar142 * auVar89._0_4_;
          auVar54._8_4_ = fVar140 * fVar140 * fVar140 * auVar89._8_4_;
          auVar54._12_4_ = fVar141 * fVar141 * fVar141 * auVar89._12_4_;
          auVar54._16_4_ = fVar167 * fVar167 * fVar167 * auVar89._16_4_;
          auVar54._20_4_ = fVar169 * fVar169 * fVar169 * auVar89._20_4_;
          auVar54._24_4_ = fVar166 * fVar166 * fVar166 * auVar89._24_4_;
          auVar54._28_4_ = auVar89._28_4_;
          auVar89 = vfmadd231ps_avx512vl(auVar54,auVar90,auVar102);
          auVar55._4_4_ = auVar118._4_4_ * auVar89._4_4_;
          auVar55._0_4_ = auVar118._0_4_ * auVar89._0_4_;
          auVar55._8_4_ = auVar118._8_4_ * auVar89._8_4_;
          auVar55._12_4_ = auVar118._12_4_ * auVar89._12_4_;
          auVar55._16_4_ = auVar118._16_4_ * auVar89._16_4_;
          auVar55._20_4_ = auVar118._20_4_ * auVar89._20_4_;
          auVar55._24_4_ = auVar118._24_4_ * auVar89._24_4_;
          auVar55._28_4_ = auVar102._28_4_;
          auVar56._4_4_ = auVar89._4_4_ * auVar93._4_4_;
          auVar56._0_4_ = auVar89._0_4_ * auVar93._0_4_;
          auVar56._8_4_ = auVar89._8_4_ * auVar93._8_4_;
          auVar56._12_4_ = auVar89._12_4_ * auVar93._12_4_;
          auVar56._16_4_ = auVar89._16_4_ * auVar93._16_4_;
          auVar56._20_4_ = auVar89._20_4_ * auVar93._20_4_;
          auVar56._24_4_ = auVar89._24_4_ * auVar93._24_4_;
          auVar56._28_4_ = auVar93._28_4_;
          auVar93 = vmulps_avx512vl(auVar89,auVar98);
          auVar80 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar81),auVar88);
          auVar89 = ZEXT1632(auVar81);
          auVar79 = vfmadd213ps_fma(auVar53,auVar89,auVar85);
          auVar90 = vfmadd213ps_avx512vl(auVar91,auVar89,auVar94);
          auVar102 = vfmadd213ps_avx512vl(auVar55,ZEXT1632(auVar82),auVar86);
          auVar83 = vfnmadd213ps_fma(auVar52,auVar89,auVar88);
          auVar101 = ZEXT1632(auVar82);
          auVar7 = vfmadd213ps_fma(auVar56,auVar101,auVar97);
          auVar147 = vfnmadd213ps_fma(auVar53,auVar89,auVar85);
          auVar8 = vfmadd213ps_fma(auVar93,auVar101,auVar92);
          auVar85 = ZEXT1632(auVar81);
          auVar84 = vfnmadd231ps_fma(auVar94,auVar85,auVar91);
          auVar150 = vfnmadd213ps_fma(auVar55,auVar101,auVar86);
          auVar151 = vfnmadd213ps_fma(auVar56,auVar101,auVar97);
          auVar172 = vfnmadd231ps_fma(auVar92,ZEXT1632(auVar82),auVar93);
          auVar92 = vsubps_avx512vl(auVar102,ZEXT1632(auVar83));
          auVar93 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar147));
          auVar89 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar84));
          auVar57._4_4_ = auVar93._4_4_ * auVar84._4_4_;
          auVar57._0_4_ = auVar93._0_4_ * auVar84._0_4_;
          auVar57._8_4_ = auVar93._8_4_ * auVar84._8_4_;
          auVar57._12_4_ = auVar93._12_4_ * auVar84._12_4_;
          auVar57._16_4_ = auVar93._16_4_ * 0.0;
          auVar57._20_4_ = auVar93._20_4_ * 0.0;
          auVar57._24_4_ = auVar93._24_4_ * 0.0;
          auVar57._28_4_ = auVar91._28_4_;
          auVar81 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar147),auVar89);
          auVar58._4_4_ = auVar89._4_4_ * auVar83._4_4_;
          auVar58._0_4_ = auVar89._0_4_ * auVar83._0_4_;
          auVar58._8_4_ = auVar89._8_4_ * auVar83._8_4_;
          auVar58._12_4_ = auVar89._12_4_ * auVar83._12_4_;
          auVar58._16_4_ = auVar89._16_4_ * 0.0;
          auVar58._20_4_ = auVar89._20_4_ * 0.0;
          auVar58._24_4_ = auVar89._24_4_ * 0.0;
          auVar58._28_4_ = auVar89._28_4_;
          auVar9 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar84),auVar92);
          auVar59._4_4_ = auVar147._4_4_ * auVar92._4_4_;
          auVar59._0_4_ = auVar147._0_4_ * auVar92._0_4_;
          auVar59._8_4_ = auVar147._8_4_ * auVar92._8_4_;
          auVar59._12_4_ = auVar147._12_4_ * auVar92._12_4_;
          auVar59._16_4_ = auVar92._16_4_ * 0.0;
          auVar59._20_4_ = auVar92._20_4_ * 0.0;
          auVar59._24_4_ = auVar92._24_4_ * 0.0;
          auVar59._28_4_ = auVar92._28_4_;
          auVar10 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar83),auVar93);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar98,ZEXT1632(auVar9));
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar81));
          uVar72 = vcmpps_avx512vl(auVar93,auVar98,2);
          bVar70 = (byte)uVar72;
          fVar78 = (float)((uint)(bVar70 & 1) * auVar80._0_4_ |
                          (uint)!(bool)(bVar70 & 1) * auVar150._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar127 = (float)((uint)bVar14 * auVar80._4_4_ | (uint)!bVar14 * auVar150._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar129 = (float)((uint)bVar14 * auVar80._8_4_ | (uint)!bVar14 * auVar150._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar131 = (float)((uint)bVar14 * auVar80._12_4_ | (uint)!bVar14 * auVar150._12_4_);
          auVar101 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar78))));
          fVar126 = (float)((uint)(bVar70 & 1) * auVar79._0_4_ |
                           (uint)!(bool)(bVar70 & 1) * auVar151._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          fVar128 = (float)((uint)bVar14 * auVar79._4_4_ | (uint)!bVar14 * auVar151._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          fVar130 = (float)((uint)bVar14 * auVar79._8_4_ | (uint)!bVar14 * auVar151._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          fVar132 = (float)((uint)bVar14 * auVar79._12_4_ | (uint)!bVar14 * auVar151._12_4_);
          auVar95 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar126))));
          auVar119._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar90._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar172._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar172._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar172._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar172._12_4_)
          ;
          fVar140 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar90._16_4_);
          auVar119._16_4_ = fVar140;
          fVar133 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar90._20_4_);
          auVar119._20_4_ = fVar133;
          fVar142 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar90._24_4_);
          auVar119._24_4_ = fVar142;
          iVar2 = (uint)(byte)(uVar72 >> 7) * auVar90._28_4_;
          auVar119._28_4_ = iVar2;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar102);
          auVar120._0_4_ =
               (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar81._0_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar81._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar81._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar81._12_4_;
          auVar120._16_4_ = (uint)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_;
          auVar120._20_4_ = (uint)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_;
          auVar120._24_4_ = (uint)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_;
          auVar120._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar147),ZEXT1632(auVar7));
          auVar121._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar93._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar80._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar80._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar80._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar80._12_4_);
          fVar169 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_);
          auVar121._16_4_ = fVar169;
          fVar141 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_);
          auVar121._20_4_ = fVar141;
          fVar167 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_);
          auVar121._24_4_ = fVar167;
          auVar121._28_4_ = (uint)(byte)(uVar72 >> 7) * auVar93._28_4_;
          auVar93 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar8));
          auVar122._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar93._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar79._0_4_);
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar14 * auVar93._4_4_ | (uint)!bVar14 * auVar79._4_4_);
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar14 * auVar93._8_4_ | (uint)!bVar14 * auVar79._8_4_);
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar14 * auVar93._12_4_ | (uint)!bVar14 * auVar79._12_4_);
          fVar149 = (float)((uint)((byte)(uVar72 >> 4) & 1) * auVar93._16_4_);
          auVar122._16_4_ = fVar149;
          fVar168 = (float)((uint)((byte)(uVar72 >> 5) & 1) * auVar93._20_4_);
          auVar122._20_4_ = fVar168;
          fVar166 = (float)((uint)((byte)(uVar72 >> 6) & 1) * auVar93._24_4_);
          auVar122._24_4_ = fVar166;
          iVar3 = (uint)(byte)(uVar72 >> 7) * auVar93._28_4_;
          auVar122._28_4_ = iVar3;
          auVar123._0_4_ =
               (uint)(bVar70 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar102._0_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar123._4_4_ = (uint)bVar14 * (int)auVar83._4_4_ | (uint)!bVar14 * auVar102._4_4_;
          bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar123._8_4_ = (uint)bVar14 * (int)auVar83._8_4_ | (uint)!bVar14 * auVar102._8_4_;
          bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar123._12_4_ = (uint)bVar14 * (int)auVar83._12_4_ | (uint)!bVar14 * auVar102._12_4_;
          auVar123._16_4_ = (uint)!(bool)((byte)(uVar72 >> 4) & 1) * auVar102._16_4_;
          auVar123._20_4_ = (uint)!(bool)((byte)(uVar72 >> 5) & 1) * auVar102._20_4_;
          auVar123._24_4_ = (uint)!(bool)((byte)(uVar72 >> 6) & 1) * auVar102._24_4_;
          auVar123._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar102._28_4_;
          bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar72 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar72 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar102 = vsubps_avx512vl(auVar123,auVar101);
          auVar89 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar147._12_4_ |
                                                  (uint)!bVar18 * auVar7._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar147._8_4_ |
                                                           (uint)!bVar17 * auVar7._8_4_,
                                                           CONCAT44((uint)bVar14 *
                                                                    (int)auVar147._4_4_ |
                                                                    (uint)!bVar14 * auVar7._4_4_,
                                                                    (uint)(bVar70 & 1) *
                                                                    (int)auVar147._0_4_ |
                                                                    (uint)!(bool)(bVar70 & 1) *
                                                                    auVar7._0_4_)))),auVar95);
          auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar84._12_4_ |
                                                  (uint)!bVar19 * auVar8._12_4_,
                                                  CONCAT48((uint)bVar16 * (int)auVar84._8_4_ |
                                                           (uint)!bVar16 * auVar8._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar84._4_4_ |
                                                                    (uint)!bVar15 * auVar8._4_4_,
                                                                    (uint)(bVar70 & 1) *
                                                                    (int)auVar84._0_4_ |
                                                                    (uint)!(bool)(bVar70 & 1) *
                                                                    auVar8._0_4_)))),auVar119);
          auVar91 = vsubps_avx(auVar101,auVar120);
          auVar92 = vsubps_avx(auVar95,auVar121);
          auVar94 = vsubps_avx(auVar119,auVar122);
          auVar60._4_4_ = auVar90._4_4_ * fVar127;
          auVar60._0_4_ = auVar90._0_4_ * fVar78;
          auVar60._8_4_ = auVar90._8_4_ * fVar129;
          auVar60._12_4_ = auVar90._12_4_ * fVar131;
          auVar60._16_4_ = auVar90._16_4_ * 0.0;
          auVar60._20_4_ = auVar90._20_4_ * 0.0;
          auVar60._24_4_ = auVar90._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar60,auVar119,auVar102);
          auVar153._0_4_ = fVar126 * auVar102._0_4_;
          auVar153._4_4_ = fVar128 * auVar102._4_4_;
          auVar153._8_4_ = fVar130 * auVar102._8_4_;
          auVar153._12_4_ = fVar132 * auVar102._12_4_;
          auVar153._16_4_ = auVar102._16_4_ * 0.0;
          auVar153._20_4_ = auVar102._20_4_ * 0.0;
          auVar153._24_4_ = auVar102._24_4_ * 0.0;
          auVar153._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar153,auVar101,auVar89);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar98,ZEXT1632(auVar81));
          auVar159._0_4_ = auVar89._0_4_ * auVar119._0_4_;
          auVar159._4_4_ = auVar89._4_4_ * auVar119._4_4_;
          auVar159._8_4_ = auVar89._8_4_ * auVar119._8_4_;
          auVar159._12_4_ = auVar89._12_4_ * auVar119._12_4_;
          auVar159._16_4_ = auVar89._16_4_ * fVar140;
          auVar159._20_4_ = auVar89._20_4_ * fVar133;
          auVar159._24_4_ = auVar89._24_4_ * fVar142;
          auVar159._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar159,auVar95,auVar90);
          auVar96 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar81));
          auVar93 = vmulps_avx512vl(auVar94,auVar120);
          auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar122);
          auVar61._4_4_ = auVar92._4_4_ * auVar122._4_4_;
          auVar61._0_4_ = auVar92._0_4_ * auVar122._0_4_;
          auVar61._8_4_ = auVar92._8_4_ * auVar122._8_4_;
          auVar61._12_4_ = auVar92._12_4_ * auVar122._12_4_;
          auVar61._16_4_ = auVar92._16_4_ * fVar149;
          auVar61._20_4_ = auVar92._20_4_ * fVar168;
          auVar61._24_4_ = auVar92._24_4_ * fVar166;
          auVar61._28_4_ = iVar3;
          auVar81 = vfmsub231ps_fma(auVar61,auVar121,auVar94);
          auVar160._0_4_ = auVar121._0_4_ * auVar91._0_4_;
          auVar160._4_4_ = auVar121._4_4_ * auVar91._4_4_;
          auVar160._8_4_ = auVar121._8_4_ * auVar91._8_4_;
          auVar160._12_4_ = auVar121._12_4_ * auVar91._12_4_;
          auVar160._16_4_ = fVar169 * auVar91._16_4_;
          auVar160._20_4_ = fVar141 * auVar91._20_4_;
          auVar160._24_4_ = fVar167 * auVar91._24_4_;
          auVar160._28_4_ = 0;
          auVar80 = vfmsub231ps_fma(auVar160,auVar92,auVar120);
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar98,auVar93);
          auVar88 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar81));
          auVar93 = vmaxps_avx(auVar96,auVar88);
          uVar143 = vcmpps_avx512vl(auVar93,auVar98,2);
          bVar77 = bVar77 & (byte)uVar143;
          auVar183 = ZEXT3264(auVar170);
          auVar87 = local_620;
          if (bVar77 == 0) goto LAB_019ef79e;
          auVar62._4_4_ = auVar94._4_4_ * auVar89._4_4_;
          auVar62._0_4_ = auVar94._0_4_ * auVar89._0_4_;
          auVar62._8_4_ = auVar94._8_4_ * auVar89._8_4_;
          auVar62._12_4_ = auVar94._12_4_ * auVar89._12_4_;
          auVar62._16_4_ = auVar94._16_4_ * auVar89._16_4_;
          auVar62._20_4_ = auVar94._20_4_ * auVar89._20_4_;
          auVar62._24_4_ = auVar94._24_4_ * auVar89._24_4_;
          auVar62._28_4_ = auVar93._28_4_;
          auVar79 = vfmsub231ps_fma(auVar62,auVar92,auVar90);
          auVar63._4_4_ = auVar90._4_4_ * auVar91._4_4_;
          auVar63._0_4_ = auVar90._0_4_ * auVar91._0_4_;
          auVar63._8_4_ = auVar90._8_4_ * auVar91._8_4_;
          auVar63._12_4_ = auVar90._12_4_ * auVar91._12_4_;
          auVar63._16_4_ = auVar90._16_4_ * auVar91._16_4_;
          auVar63._20_4_ = auVar90._20_4_ * auVar91._20_4_;
          auVar63._24_4_ = auVar90._24_4_ * auVar91._24_4_;
          auVar63._28_4_ = auVar90._28_4_;
          auVar80 = vfmsub231ps_fma(auVar63,auVar102,auVar94);
          auVar64._4_4_ = auVar92._4_4_ * auVar102._4_4_;
          auVar64._0_4_ = auVar92._0_4_ * auVar102._0_4_;
          auVar64._8_4_ = auVar92._8_4_ * auVar102._8_4_;
          auVar64._12_4_ = auVar92._12_4_ * auVar102._12_4_;
          auVar64._16_4_ = auVar92._16_4_ * auVar102._16_4_;
          auVar64._20_4_ = auVar92._20_4_ * auVar102._20_4_;
          auVar64._24_4_ = auVar92._24_4_ * auVar102._24_4_;
          auVar64._28_4_ = auVar92._28_4_;
          auVar7 = vfmsub231ps_fma(auVar64,auVar91,auVar89);
          auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar7));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar79),auVar98);
          auVar89 = vrcp14ps_avx512vl(auVar93);
          auVar91 = auVar191._0_32_;
          auVar90 = vfnmadd213ps_avx512vl(auVar89,auVar93,auVar91);
          auVar81 = vfmadd132ps_fma(auVar90,auVar89,auVar89);
          auVar65._4_4_ = auVar7._4_4_ * auVar119._4_4_;
          auVar65._0_4_ = auVar7._0_4_ * auVar119._0_4_;
          auVar65._8_4_ = auVar7._8_4_ * auVar119._8_4_;
          auVar65._12_4_ = auVar7._12_4_ * auVar119._12_4_;
          auVar65._16_4_ = fVar140 * 0.0;
          auVar65._20_4_ = fVar133 * 0.0;
          auVar65._24_4_ = fVar142 * 0.0;
          auVar65._28_4_ = iVar2;
          auVar80 = vfmadd231ps_fma(auVar65,auVar95,ZEXT1632(auVar80));
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar101,ZEXT1632(auVar79));
          fVar142 = auVar81._0_4_;
          fVar133 = auVar81._4_4_;
          fVar140 = auVar81._8_4_;
          fVar141 = auVar81._12_4_;
          local_3a0 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar141,
                                         CONCAT48(auVar80._8_4_ * fVar140,
                                                  CONCAT44(auVar80._4_4_ * fVar133,
                                                           auVar80._0_4_ * fVar142))));
          auVar68._4_4_ = uStack_43c;
          auVar68._0_4_ = local_440;
          auVar68._8_4_ = uStack_438;
          auVar68._12_4_ = uStack_434;
          auVar68._16_4_ = uStack_430;
          auVar68._20_4_ = uStack_42c;
          auVar68._24_4_ = uStack_428;
          auVar68._28_4_ = uStack_424;
          uVar143 = vcmpps_avx512vl(local_3a0,auVar68,0xd);
          uVar134 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar30._4_4_ = uVar134;
          auVar30._0_4_ = uVar134;
          auVar30._8_4_ = uVar134;
          auVar30._12_4_ = uVar134;
          auVar30._16_4_ = uVar134;
          auVar30._20_4_ = uVar134;
          auVar30._24_4_ = uVar134;
          auVar30._28_4_ = uVar134;
          uVar21 = vcmpps_avx512vl(local_3a0,auVar30,2);
          bVar77 = (byte)uVar143 & (byte)uVar21 & bVar77;
          if (bVar77 == 0) goto LAB_019ef79e;
          uVar143 = vcmpps_avx512vl(auVar93,auVar98,4);
          bVar77 = bVar77 & (byte)uVar143;
          auVar182 = ZEXT3264(local_620);
          if (bVar77 != 0) {
            fVar167 = auVar96._0_4_ * fVar142;
            fVar169 = auVar96._4_4_ * fVar133;
            auVar66._4_4_ = fVar169;
            auVar66._0_4_ = fVar167;
            fVar166 = auVar96._8_4_ * fVar140;
            auVar66._8_4_ = fVar166;
            fVar168 = auVar96._12_4_ * fVar141;
            auVar66._12_4_ = fVar168;
            fVar149 = auVar96._16_4_ * 0.0;
            auVar66._16_4_ = fVar149;
            fVar78 = auVar96._20_4_ * 0.0;
            auVar66._20_4_ = fVar78;
            fVar126 = auVar96._24_4_ * 0.0;
            auVar66._24_4_ = fVar126;
            auVar66._28_4_ = auVar93._28_4_;
            auVar89 = vsubps_avx512vl(auVar91,auVar66);
            local_3e0._0_4_ =
                 (float)((uint)(bVar70 & 1) * (int)fVar167 |
                        (uint)!(bool)(bVar70 & 1) * auVar89._0_4_);
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            local_3e0._4_4_ = (float)((uint)bVar14 * (int)fVar169 | (uint)!bVar14 * auVar89._4_4_);
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            local_3e0._8_4_ = (float)((uint)bVar14 * (int)fVar166 | (uint)!bVar14 * auVar89._8_4_);
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            local_3e0._12_4_ = (float)((uint)bVar14 * (int)fVar168 | (uint)!bVar14 * auVar89._12_4_)
            ;
            bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
            local_3e0._16_4_ = (float)((uint)bVar14 * (int)fVar149 | (uint)!bVar14 * auVar89._16_4_)
            ;
            bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
            local_3e0._20_4_ = (float)((uint)bVar14 * (int)fVar78 | (uint)!bVar14 * auVar89._20_4_);
            bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
            local_3e0._24_4_ = (float)((uint)bVar14 * (int)fVar126 | (uint)!bVar14 * auVar89._24_4_)
            ;
            bVar14 = SUB81(uVar72 >> 7,0);
            local_3e0._28_4_ =
                 (float)((uint)bVar14 * auVar93._28_4_ | (uint)!bVar14 * auVar89._28_4_);
            auVar93 = vsubps_avx(ZEXT1632(auVar82),auVar85);
            auVar81 = vfmadd213ps_fma(auVar93,local_3e0,auVar85);
            uVar134 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
            auVar31._4_4_ = uVar134;
            auVar31._0_4_ = uVar134;
            auVar31._8_4_ = uVar134;
            auVar31._12_4_ = uVar134;
            auVar31._16_4_ = uVar134;
            auVar31._20_4_ = uVar134;
            auVar31._24_4_ = uVar134;
            auVar31._28_4_ = uVar134;
            auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                         CONCAT48(auVar81._8_4_ + auVar81._8_4_,
                                                                  CONCAT44(auVar81._4_4_ +
                                                                           auVar81._4_4_,
                                                                           auVar81._0_4_ +
                                                                           auVar81._0_4_)))),auVar31
                                     );
            uVar143 = vcmpps_avx512vl(local_3a0,auVar93,6);
            if (((byte)uVar143 & bVar77) != 0) {
              auVar146._0_4_ = auVar88._0_4_ * fVar142;
              auVar146._4_4_ = auVar88._4_4_ * fVar133;
              auVar146._8_4_ = auVar88._8_4_ * fVar140;
              auVar146._12_4_ = auVar88._12_4_ * fVar141;
              auVar146._16_4_ = auVar88._16_4_ * 0.0;
              auVar146._20_4_ = auVar88._20_4_ * 0.0;
              auVar146._24_4_ = auVar88._24_4_ * 0.0;
              auVar146._28_4_ = 0;
              auVar93 = vsubps_avx512vl(auVar91,auVar146);
              auVar124._0_4_ =
                   (uint)(bVar70 & 1) * (int)auVar146._0_4_ |
                   (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
              bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar124._4_4_ = (uint)bVar14 * (int)auVar146._4_4_ | (uint)!bVar14 * auVar93._4_4_;
              bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar124._8_4_ = (uint)bVar14 * (int)auVar146._8_4_ | (uint)!bVar14 * auVar93._8_4_;
              bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar124._12_4_ = (uint)bVar14 * (int)auVar146._12_4_ | (uint)!bVar14 * auVar93._12_4_
              ;
              bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar124._16_4_ = (uint)bVar14 * (int)auVar146._16_4_ | (uint)!bVar14 * auVar93._16_4_
              ;
              bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar124._20_4_ = (uint)bVar14 * (int)auVar146._20_4_ | (uint)!bVar14 * auVar93._20_4_
              ;
              bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar124._24_4_ = (uint)bVar14 * (int)auVar146._24_4_ | (uint)!bVar14 * auVar93._24_4_
              ;
              auVar124._28_4_ = (uint)!SUB81(uVar72 >> 7,0) * auVar93._28_4_;
              auVar32._8_4_ = 0x40000000;
              auVar32._0_8_ = 0x4000000040000000;
              auVar32._12_4_ = 0x40000000;
              auVar32._16_4_ = 0x40000000;
              auVar32._20_4_ = 0x40000000;
              auVar32._24_4_ = 0x40000000;
              auVar32._28_4_ = 0x40000000;
              local_3c0 = vfmsub132ps_avx512vl(auVar124,auVar91,auVar32);
              local_380 = (undefined4)lVar75;
              local_360 = local_5f0._0_8_;
              uStack_358 = local_5f0._8_8_;
              local_350 = local_600._0_8_;
              uStack_348 = local_600._8_8_;
              pGVar12 = (context->scene->geometries).items[uVar11].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                bVar70 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar70 = 1, pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar81 = vcvtsi2ss_avx512f(auVar184._0_16_,local_380);
                fVar142 = auVar81._0_4_;
                local_320[0] = (fVar142 + local_3e0._0_4_ + 0.0) * (float)local_400._0_4_;
                local_320[1] = (fVar142 + local_3e0._4_4_ + 1.0) * (float)local_400._4_4_;
                local_320[2] = (fVar142 + local_3e0._8_4_ + 2.0) * fStack_3f8;
                local_320[3] = (fVar142 + local_3e0._12_4_ + 3.0) * fStack_3f4;
                fStack_310 = (fVar142 + local_3e0._16_4_ + 4.0) * fStack_3f0;
                fStack_30c = (fVar142 + local_3e0._20_4_ + 5.0) * fStack_3ec;
                fStack_308 = (fVar142 + local_3e0._24_4_ + 6.0) * fStack_3e8;
                fStack_304 = fVar142 + local_3e0._28_4_ + 7.0;
                local_300 = local_3c0;
                local_2e0 = local_3a0;
                uVar72 = 0;
                uVar73 = (ulong)((byte)uVar143 & bVar77);
                for (uVar23 = uVar73; local_37c = iVar22, local_370 = auVar20, (uVar23 & 1) == 0;
                    uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                  uVar72 = uVar72 + 1;
                }
                while (auVar81 = auVar184._0_16_, uVar73 != 0) {
                  uVar134 = *(undefined4 *)(ray + k * 4 + 0x100);
                  fVar142 = local_320[uVar72];
                  auVar145._4_4_ = fVar142;
                  auVar145._0_4_ = fVar142;
                  auVar145._8_4_ = fVar142;
                  auVar145._12_4_ = fVar142;
                  local_220._16_4_ = fVar142;
                  local_220._0_16_ = auVar145;
                  local_220._20_4_ = fVar142;
                  local_220._24_4_ = fVar142;
                  local_220._28_4_ = fVar142;
                  local_200 = *(undefined4 *)(local_300 + uVar72 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2e0 + uVar72 * 4);
                  local_650.context = context->user;
                  fVar133 = 1.0 - fVar142;
                  auVar25._8_4_ = 0x80000000;
                  auVar25._0_8_ = 0x8000000080000000;
                  auVar25._12_4_ = 0x80000000;
                  auVar80 = vxorps_avx512vl(ZEXT416((uint)fVar133),auVar25);
                  auVar81 = ZEXT416((uint)(fVar142 * fVar133 * 4.0));
                  auVar82 = vfnmsub213ss_fma(auVar145,auVar145,auVar81);
                  auVar81 = vfmadd213ss_fma(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),auVar81);
                  fVar133 = fVar133 * auVar80._0_4_ * 0.5;
                  fVar140 = auVar82._0_4_ * 0.5;
                  fVar141 = auVar81._0_4_ * 0.5;
                  fVar142 = fVar142 * fVar142 * 0.5;
                  auVar163._0_4_ = fVar142 * (float)local_450._0_4_;
                  auVar163._4_4_ = fVar142 * (float)local_450._4_4_;
                  auVar163._8_4_ = fVar142 * fStack_448;
                  auVar163._12_4_ = fVar142 * fStack_444;
                  auVar137._4_4_ = fVar141;
                  auVar137._0_4_ = fVar141;
                  auVar137._8_4_ = fVar141;
                  auVar137._12_4_ = fVar141;
                  auVar81 = vfmadd132ps_fma(auVar137,auVar163,local_600);
                  auVar155._4_4_ = fVar140;
                  auVar155._0_4_ = fVar140;
                  auVar155._8_4_ = fVar140;
                  auVar155._12_4_ = fVar140;
                  auVar81 = vfmadd132ps_fma(auVar155,auVar81,local_5f0);
                  auVar138._4_4_ = fVar133;
                  auVar138._0_4_ = fVar133;
                  auVar138._8_4_ = fVar133;
                  auVar138._12_4_ = fVar133;
                  auVar81 = vfmadd213ps_fma(auVar138,auVar20,auVar81);
                  local_280 = auVar81._0_4_;
                  auVar161._8_4_ = 1;
                  auVar161._0_8_ = 0x100000001;
                  auVar161._12_4_ = 1;
                  auVar161._16_4_ = 1;
                  auVar161._20_4_ = 1;
                  auVar161._24_4_ = 1;
                  auVar161._28_4_ = 1;
                  local_260 = vpermps_avx2(auVar161,ZEXT1632(auVar81));
                  auVar165._8_4_ = 2;
                  auVar165._0_8_ = 0x200000002;
                  auVar165._12_4_ = 2;
                  auVar165._16_4_ = 2;
                  auVar165._20_4_ = 2;
                  auVar165._24_4_ = 2;
                  auVar165._28_4_ = 2;
                  local_240 = vpermps_avx2(auVar165,ZEXT1632(auVar81));
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_2a0._0_8_;
                  uStack_1d8 = local_2a0._8_8_;
                  uStack_1d0 = local_2a0._16_8_;
                  uStack_1c8 = local_2a0._24_8_;
                  local_1c0 = local_420;
                  vpcmpeqd_avx2(local_420,local_420);
                  local_1a0 = (local_650.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_650.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_560 = local_2c0;
                  local_650.valid = (int *)local_560;
                  local_650.geometryUserPtr = pGVar12->userPtr;
                  local_650.hit = (RTCHitN *)&local_280;
                  local_650.N = 8;
                  local_650.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar12->occlusionFilterN)(&local_650);
                  }
                  if (local_560 != (undefined1  [32])0x0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_650);
                    }
                    auVar81 = auVar184._0_16_;
                    uVar23 = vptestmd_avx512vl(local_560,local_560);
                    auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar14 = (bool)((byte)uVar23 & 1);
                    auVar125._0_4_ =
                         (uint)bVar14 * auVar93._0_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x100);
                    bVar14 = (bool)((byte)(uVar23 >> 1) & 1);
                    auVar125._4_4_ =
                         (uint)bVar14 * auVar93._4_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x104);
                    bVar14 = (bool)((byte)(uVar23 >> 2) & 1);
                    auVar125._8_4_ =
                         (uint)bVar14 * auVar93._8_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x108);
                    bVar14 = (bool)((byte)(uVar23 >> 3) & 1);
                    auVar125._12_4_ =
                         (uint)bVar14 * auVar93._12_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x10c);
                    bVar14 = (bool)((byte)(uVar23 >> 4) & 1);
                    auVar125._16_4_ =
                         (uint)bVar14 * auVar93._16_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x110);
                    bVar14 = (bool)((byte)(uVar23 >> 5) & 1);
                    auVar125._20_4_ =
                         (uint)bVar14 * auVar93._20_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x114);
                    bVar14 = (bool)((byte)(uVar23 >> 6) & 1);
                    auVar125._24_4_ =
                         (uint)bVar14 * auVar93._24_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x118);
                    bVar14 = SUB81(uVar23 >> 7,0);
                    auVar125._28_4_ =
                         (uint)bVar14 * auVar93._28_4_ |
                         (uint)!bVar14 * *(int *)(local_650.ray + 0x11c);
                    *(undefined1 (*) [32])(local_650.ray + 0x100) = auVar125;
                    if (local_560 != (undefined1  [32])0x0) {
                      bVar70 = 1;
                      goto LAB_019ef7c7;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar134;
                  uVar23 = uVar72 & 0x3f;
                  uVar72 = 0;
                  uVar73 = uVar73 ^ 1L << uVar23;
                  for (uVar23 = uVar73; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000
                      ) {
                    uVar72 = uVar72 + 1;
                  }
                }
                bVar70 = 0;
LAB_019ef7c7:
                auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar191 = ZEXT3264(auVar93);
                auVar81 = vxorps_avx512vl(auVar81,auVar81);
                auVar184 = ZEXT1664(auVar81);
                auVar185 = ZEXT3264(local_4a0);
                auVar186 = ZEXT3264(local_4c0);
                auVar187 = ZEXT3264(local_4e0);
                auVar183 = ZEXT3264(local_500);
                auVar182 = ZEXT3264(local_620);
                auVar188 = ZEXT3264(local_5a0);
                auVar189 = ZEXT3264(local_5c0);
                auVar190 = ZEXT3264(local_5e0);
              }
              bVar69 = (bool)(bVar69 | bVar70);
            }
          }
        }
      }
    }
    if (bVar69) break;
    uVar134 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar29._4_4_ = uVar134;
    auVar29._0_4_ = uVar134;
    auVar29._8_4_ = uVar134;
    auVar29._12_4_ = uVar134;
    auVar29._16_4_ = uVar134;
    auVar29._20_4_ = uVar134;
    auVar29._24_4_ = uVar134;
    auVar29._28_4_ = uVar134;
    uVar143 = vcmpps_avx512vl(local_80,auVar29,2);
    local_528 = (ulong)((uint)uVar74 & (uint)uVar143);
  }
  return local_528 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }